

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  undefined8 *puVar2;
  int iVar3;
  ZSTD_match_t *pZVar4;
  seqDef *psVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ZSTD_optimal_t *pZVar20;
  U32 UVar21;
  optState_t *poVar22;
  U32 i;
  U32 UVar23;
  U32 UVar24;
  int iVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong *puVar28;
  ulong *puVar29;
  U32 *pUVar30;
  U32 *pUVar31;
  ulong *puVar32;
  int iVar33;
  uint uVar34;
  ZSTD_optimal_t *pZVar35;
  ulong *puVar36;
  ulong uVar37;
  U32 *pUVar38;
  int iVar39;
  uint *puVar40;
  uint uVar41;
  BYTE *base;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  uint uVar47;
  long lVar48;
  uint uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong *ip;
  ulong uVar52;
  BYTE *pBVar53;
  U32 UVar54;
  uint uVar55;
  long lVar56;
  ulong uVar57;
  ulong *puVar58;
  uint uVar59;
  ulong *puVar60;
  ZSTD_optimal_t *pZVar61;
  void *pvVar62;
  uint uVar63;
  BYTE *pBVar64;
  bool bVar65;
  undefined1 auVar66 [32];
  repcodes_t rVar67;
  BYTE *pInLoopLimit;
  U32 dummy32;
  U32 nextToUpdate3;
  ulong local_248;
  U32 *local_238;
  U32 *local_230;
  ulong *local_228;
  ulong *local_220;
  ulong *local_210;
  ulong *local_1e8;
  undefined1 local_1dc [4];
  ulong *local_1d8;
  U32 *local_1d0;
  ulong *local_1c8;
  ulong *local_1c0;
  ulong *local_1b8;
  ulong *local_1b0;
  ulong *local_1a8;
  ulong *local_1a0;
  ulong *local_198;
  uint local_18c;
  uint *local_188;
  ulong local_180;
  ulong *local_178;
  ulong *local_170;
  ulong *local_168;
  U32 *local_160;
  long local_158;
  U32 (*local_150) [3];
  U32 *local_148;
  U32 *local_140;
  BYTE *local_138;
  U32 *local_130;
  BYTE *local_128;
  BYTE *local_120;
  ulong *local_118;
  optState_t *local_110;
  ZSTD_optimal_t *local_108;
  uint local_100;
  U32 local_fc;
  seqStore_t *local_f8;
  uint local_f0;
  int local_ec;
  ulong *local_e8;
  ulong local_e0;
  undefined8 local_d8;
  U32 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ZSTD_optimal_t *local_b8;
  ulong *local_b0;
  ulong local_a8;
  ZSTD_optimal_t *local_a0;
  ulong local_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a30,
                  "size_t ZSTD_compressBlock_btultra2(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  pBVar64 = (ms->window).base;
  local_f8 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (UVar54 = (ms->window).dictLimit, UVar54 == (ms->window).lowLimit)) &&
     ((0x400 < srcSize && (UVar54 == (int)src - (int)pBVar64)))) {
    ZSTD_initStats_ultra(ms,seqStore,rep,src,srcSize);
    pBVar64 = (ms->window).base;
  }
  local_110 = &ms->opt;
  puVar36 = (ulong *)((long)src + srcSize);
  puVar60 = (ulong *)((long)src + (srcSize - 8));
  uVar45 = (ms->window).dictLimit;
  local_100 = (ms->cParams).targetLength;
  if (0xffe < local_100) {
    local_100 = 0xfff;
  }
  local_180 = CONCAT71(local_180._1_7_,(ms->cParams).minMatch != 3);
  local_fc = ms->nextToUpdate;
  pZVar4 = (ms->opt).matchTable;
  local_108 = (ms->opt).priceTable;
  local_150 = (U32 (*) [3])rep;
  ZSTD_rescaleFreqs(local_110,(BYTE *)src,srcSize,2);
  ip = (ulong *)((ulong)(pBVar64 + uVar45 == (BYTE *)src) + (long)src);
  local_1c0 = puVar36;
  if (puVar60 <= ip) {
LAB_0012deb5:
    return (long)local_1c0 - (long)src;
  }
  uVar45 = (uint)(byte)local_180;
  local_e0 = (ulong)(uVar45 + 3);
  local_118 = (ulong *)(ulong)(uVar45 + 2);
  puVar1 = (ulong *)((long)puVar36 - 7);
  local_198 = (ulong *)((long)puVar36 + -3);
  local_1a0 = (ulong *)((long)puVar36 + -1);
  local_b0 = puVar36 + -4;
  local_a8 = (ulong)(uVar45 + 9 & 0xfffffff8);
  local_98 = local_e0 - 2;
  local_b8 = local_108 + 8;
  local_a0 = local_108 + 1;
  local_c8 = 0x8000000000000000;
  uStack_c0 = 0x8000000000000000;
  local_58 = 0x8000000000000000;
  uStack_50 = 0x8000000000000000;
  uStack_48 = 0x8000000000000000;
  uStack_40 = 0x8000000000000000;
  local_78 = local_98 ^ 0x8000000000000000;
  uStack_70 = local_98 ^ 0x8000000000000000;
  uStack_68 = local_98 ^ 0x8000000000000000;
  uStack_60 = local_98 ^ 0x8000000000000000;
  local_e8 = puVar60;
  uStack_90 = local_98;
  uStack_88 = local_98;
  uStack_80 = local_98;
LAB_00129b79:
  puVar36 = local_1c0;
  pBVar64 = (ms->window).base;
  uVar26 = (ulong)ms->nextToUpdate;
  if (pBVar64 + uVar26 <= ip) {
    iVar39 = (int)ip;
    local_180 = (ulong)(uint)(iVar39 - (int)src);
    UVar54 = (ms->cParams).minMatch;
    while( true ) {
      uVar45 = (uint)uVar26;
      uVar49 = (uint)((long)ip - (long)pBVar64);
      if (uVar49 <= uVar45) break;
      UVar23 = ZSTD_insertBt1(ms,pBVar64 + uVar26,(BYTE *)puVar36,UVar54,0);
      uVar26 = (ulong)(UVar23 + uVar45);
      if (UVar23 + uVar45 <= uVar45) {
LAB_0012df36:
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4786,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar64) >> 0x20 != 0) {
LAB_0012e160:
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4789,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)puVar36 - (long)pBVar64) >> 0x20 != 0) {
LAB_0012e13e:
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x478a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar49;
    pBVar64 = local_120;
    local_1b0 = (ulong *)src;
    if (1 < UVar54 - 6) {
      if (UVar54 == 5) {
        uVar26 = (ulong)((int)local_180 == 0);
        uVar45 = (ms->cParams).targetLength;
        if (0xffe < uVar45) {
          uVar45 = 0xfff;
        }
        pUVar30 = (U32 *)(ms->window).base;
        uVar59 = iVar39 - (int)pUVar30;
        uVar50 = *ip * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
        uVar49 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        iVar39 = uVar59 - uVar49;
        local_248 = 0;
        if (uVar59 < uVar49) {
          iVar39 = 0;
        }
        local_168 = (ulong *)CONCAT44(local_168._4_4_,iVar39);
        uVar63 = (ms->window).lowLimit;
        uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar41 = uVar59 - uVar43;
        if (uVar59 - uVar63 <= uVar43) {
          uVar41 = uVar63;
        }
        local_130 = ms->chainTable;
        uVar43 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          uVar41 = uVar63;
        }
        uVar47 = uVar41 + (uVar41 == 0);
        local_188 = (uint *)CONCAT44(local_188._4_4_,uVar47);
        local_158 = CONCAT44(local_158._4_4_,uVar49);
        uVar46 = (ulong)((uVar49 & uVar59) * 2);
        local_230 = local_130 + uVar46;
        pUVar38 = local_130 + uVar46 + 1;
        local_1c8 = (ulong *)ms->hashTable;
        uVar63 = *(uint *)((long)local_1c8 + uVar50 * 4);
        local_1d8 = (ulong *)CONCAT44(local_1d8._4_4_,uVar59 + 8);
        uVar44 = uVar59 + 9;
        uVar49 = (ms->cParams).searchLog;
        uVar46 = uVar26 + 3;
        puVar60 = (ulong *)((long)ip + 4);
        puVar29 = local_118;
        do {
          if (uVar26 == 3) {
            UVar54 = (*local_150)[0] - 1;
          }
          else {
            UVar54 = (*local_150)[uVar26];
          }
          local_1d0 = pUVar30;
          if (uVar59 < uVar43) goto LAB_0012df55;
          if (UVar54 - 1 < uVar59 - uVar43) {
            if ((uint)*ip != *(uint *)((long)ip - (ulong)UVar54)) goto LAB_0012a4ff;
            lVar48 = -(ulong)UVar54;
            puVar58 = (ulong *)((long)puVar60 + lVar48);
            puVar28 = puVar60;
            if (puVar60 < puVar1) {
              if (*puVar58 == *puVar60) {
                lVar48 = lVar48 + 0xc;
                lVar56 = 0;
                do {
                  puVar28 = (ulong *)((long)ip + lVar56 + 0xc);
                  if (puVar1 <= puVar28) {
                    puVar58 = (ulong *)((long)ip + lVar56 + lVar48);
                    goto LAB_0012a51c;
                  }
                  uVar51 = *(ulong *)((long)ip + lVar56 + lVar48);
                  lVar56 = lVar56 + 8;
                } while (uVar51 == *puVar28);
                uVar51 = *puVar28 ^ uVar51;
                uVar37 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                uVar55 = ((uint)(uVar37 >> 3) & 0x1fffffff) + (int)lVar56;
              }
              else {
                uVar37 = *puVar60 ^ *puVar58;
                uVar51 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                  }
                }
                uVar55 = (uint)(uVar51 >> 3) & 0x1fffffff;
              }
            }
            else {
LAB_0012a51c:
              if ((puVar28 < local_198) && ((uint)*puVar58 == (uint)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 4);
                puVar58 = (ulong *)((long)puVar58 + 4);
              }
              if ((puVar28 < local_1a0) && ((short)*puVar58 == (short)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 2);
                puVar58 = (ulong *)((long)puVar58 + 2);
              }
              if (puVar28 < puVar36) {
                puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar58 == (BYTE)*puVar28));
              }
              uVar55 = (int)puVar28 - (int)puVar60;
            }
            puVar58 = (ulong *)(ulong)(uVar55 + 4);
          }
          else {
            if (uVar59 < uVar41) goto LAB_0012df77;
LAB_0012a4ff:
            puVar58 = (ulong *)0x0;
          }
          if (puVar29 < puVar58) {
            pZVar4[local_248].off = (int)uVar26 - (uint)((int)local_180 == 0);
            pZVar4[local_248].len = (uint)puVar58;
            local_248 = (ulong)((int)local_248 + 1);
            if ((uVar45 < (uint)puVar58) ||
               (puVar29 = puVar58, puVar36 = local_1c0,
               (ulong *)((long)ip + (long)puVar58) == local_1c0)) goto LAB_0012aeb0;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < uVar46);
        *(uint *)((long)local_1c8 + uVar50 * 4) = uVar59;
        if (uVar47 <= uVar63) {
          uVar45 = ~(-1 << ((byte)uVar49 & 0x1f));
          local_1b8 = ip + 1;
          puVar60 = (ulong *)0x0;
          puVar58 = (ulong *)0x0;
          do {
            puVar28 = puVar58;
            if (puVar60 < puVar58) {
              puVar28 = puVar60;
            }
            local_1c8 = puVar58;
            if (uVar59 <= uVar63) goto LAB_0012e03a;
            uVar26 = (long)puVar28 + (ulong)uVar63;
            if (uVar26 < uVar43) goto LAB_0012e018;
            pvVar62 = (void *)((ulong)uVar63 + (long)local_1d0);
            if ((uVar43 <= uVar63) && (iVar39 = bcmp(pvVar62,ip,(size_t)puVar28), iVar39 != 0))
            goto LAB_0012e09d;
            puVar58 = (ulong *)((long)ip + (long)puVar28);
            puVar27 = (ulong *)((long)pvVar62 + (long)puVar28);
            puVar32 = puVar58;
            if (puVar58 < puVar1) {
              if (*puVar27 == *puVar58) {
                lVar48 = 0;
                do {
                  puVar32 = (ulong *)((long)local_1b8 + (long)puVar28 + lVar48);
                  if (puVar1 <= puVar32) {
                    puVar27 = (ulong *)((long)pUVar30 + uVar26 + lVar48 + 8);
                    goto LAB_0012a737;
                  }
                  uVar50 = *(ulong *)((long)pUVar30 + lVar48 + uVar26 + 8);
                  lVar48 = lVar48 + 8;
                } while (uVar50 == *puVar32);
                uVar50 = *puVar32 ^ uVar50;
                uVar26 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar48;
              }
              else {
                uVar50 = *puVar58 ^ *puVar27;
                uVar26 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = uVar26 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0012a737:
              if ((puVar32 < local_198) && ((uint)*puVar27 == (uint)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar32 < local_1a0) && ((short)*puVar27 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar32 < puVar36) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar32));
              }
              uVar26 = (long)puVar32 - (long)puVar58;
            }
            puVar58 = (ulong *)(uVar26 + (long)puVar28);
            if (puVar29 < puVar58) {
              if (uVar44 < uVar63 || uVar44 - uVar63 == 0) goto LAB_0012e0bc;
              if ((ulong *)(ulong)(uVar44 - uVar63) < puVar58) {
                uVar44 = uVar63 + (U32)puVar58;
              }
              pZVar4[local_248].off = (uVar59 + 2) - uVar63;
              pZVar4[local_248].len = (U32)puVar58;
              local_248 = (ulong)((int)local_248 + 1);
              if (((ulong *)0x1000 < puVar58) ||
                 (puVar29 = puVar58, (ulong *)((long)ip + (long)puVar58) == puVar36)) break;
            }
            pUVar31 = local_130 + (uVar63 & (uint)local_158) * 2;
            if (*(byte *)((long)pvVar62 + (long)puVar58) < *(byte *)((long)ip + (long)puVar58)) {
              *local_230 = uVar63;
              if (uVar63 <= (uint)local_168) goto LAB_0012dd1f;
              pUVar31 = pUVar31 + 1;
              puVar60 = puVar58;
              puVar58 = local_1c8;
              local_230 = pUVar31;
            }
            else {
              *pUVar38 = uVar63;
              pUVar38 = pUVar31;
              if (uVar63 <= (uint)local_168) goto LAB_0012dd15;
            }
            bVar65 = uVar45 == 0;
            uVar45 = uVar45 - 1;
            if (bVar65) break;
            uVar63 = *pUVar31;
          } while ((uint)local_188 <= uVar63);
        }
      }
      else {
        if (UVar54 == 3) {
          uVar26 = (ulong)((int)local_180 == 0);
          uVar45 = (ms->cParams).targetLength;
          if (0xffe < uVar45) {
            uVar45 = 0xfff;
          }
          pBVar53 = (ms->window).base;
          uVar63 = iVar39 - (int)pBVar53;
          uVar59 = (uint)*ip * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
          uVar49 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar39 = uVar63 - uVar49;
          local_248 = 0;
          if (uVar63 < uVar49) {
            iVar39 = 0;
          }
          local_168 = (ulong *)CONCAT44(local_168._4_4_,iVar39);
          uVar41 = (ms->window).lowLimit;
          uVar44 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar43 = uVar63 - uVar44;
          if (uVar63 - uVar41 <= uVar44) {
            uVar43 = uVar41;
          }
          local_130 = ms->chainTable;
          uVar44 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            uVar43 = uVar41;
          }
          local_188 = (uint *)CONCAT44(local_188._4_4_,uVar43 + (uVar43 == 0));
          local_158 = CONCAT44(local_158._4_4_,uVar49);
          uVar50 = (ulong)((uVar49 & uVar63) * 2);
          local_1d0 = local_130 + uVar50;
          local_238 = local_130 + uVar50 + 1;
          pUVar30 = ms->hashTable;
          uVar49 = pUVar30[uVar59];
          local_1d8 = (ulong *)CONCAT44(local_1d8._4_4_,uVar63 + 8);
          uVar47 = uVar63 + 9;
          uVar41 = (ms->cParams).searchLog;
          uVar50 = uVar26 + 3;
          puVar60 = (ulong *)((long)ip + 3);
          puVar29 = local_118;
          do {
            if (uVar26 == 3) {
              UVar54 = (*local_150)[0] - 1;
            }
            else {
              UVar54 = (*local_150)[uVar26];
            }
            if (uVar63 < uVar44) goto LAB_0012df55;
            if (UVar54 - 1 < uVar63 - uVar44) {
              if (((*(uint *)((long)ip - (ulong)UVar54) ^ (uint)*ip) & 0xffffff) == 0) {
                lVar48 = -(ulong)UVar54;
                puVar58 = (ulong *)((long)puVar60 + lVar48);
                puVar28 = puVar60;
                if (puVar60 < puVar1) {
                  if (*puVar58 == *puVar60) {
                    lVar48 = lVar48 + 0xb;
                    lVar56 = 0;
                    do {
                      puVar28 = (ulong *)((long)ip + lVar56 + 0xb);
                      if (puVar1 <= puVar28) {
                        puVar58 = (ulong *)((long)ip + lVar56 + lVar48);
                        goto LAB_00129e64;
                      }
                      uVar46 = *(ulong *)((long)ip + lVar56 + lVar48);
                      lVar56 = lVar56 + 8;
                    } while (uVar46 == *puVar28);
                    uVar46 = *puVar28 ^ uVar46;
                    uVar51 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar55 = ((uint)(uVar51 >> 3) & 0x1fffffff) + (int)lVar56;
                  }
                  else {
                    uVar51 = *puVar60 ^ *puVar58;
                    uVar46 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar55 = (uint)(uVar46 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00129e64:
                  if ((puVar28 < local_198) && ((uint)*puVar58 == (uint)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar58 = (ulong *)((long)puVar58 + 4);
                  }
                  if ((puVar28 < local_1a0) && ((short)*puVar58 == (short)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 2);
                    puVar58 = (ulong *)((long)puVar58 + 2);
                  }
                  if (puVar28 < puVar36) {
                    puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar58 == (BYTE)*puVar28));
                  }
                  uVar55 = (int)puVar28 - (int)puVar60;
                }
                uVar55 = uVar55 + 3;
              }
              else {
                uVar55 = 0;
              }
            }
            else {
              if (uVar63 < uVar43) goto LAB_0012df77;
              uVar55 = 0;
            }
            puVar58 = (ulong *)(ulong)uVar55;
            if (puVar29 < puVar58) {
              pZVar4[local_248].off = (int)uVar26 - (uint)((int)local_180 == 0);
              pZVar4[local_248].len = uVar55;
              local_248 = (ulong)((int)local_248 + 1);
              if ((uVar45 < uVar55) ||
                 (puVar29 = puVar58, puVar36 = local_1c0,
                 (ulong *)((long)ip + (long)puVar58) == local_1c0)) goto LAB_0012aeb0;
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 < uVar50);
          if (puVar29 < (ulong *)0x3) {
            UVar54 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_fc,(BYTE *)ip);
            if ((UVar54 < (uint)local_188) || (0x3ffff < uVar63 - UVar54)) goto LAB_0012ae64;
            uVar26 = (ulong)UVar54;
            if (*(ulong *)(pBVar53 + uVar26) == *ip) {
              lVar48 = 0;
              do {
                local_1c8 = (ulong *)((long)ip + lVar48 + 8);
                if (puVar1 <= local_1c8) {
                  puVar40 = (uint *)(pBVar53 + lVar48 + uVar26 + 8);
                  if ((local_1c8 < local_198) && (*puVar40 == (uint)*local_1c8)) {
                    local_1c8 = (ulong *)((long)ip + lVar48 + 0xc);
                    puVar40 = (uint *)(pBVar53 + lVar48 + uVar26 + 0xc);
                  }
                  if ((local_1c8 < local_1a0) && ((short)*puVar40 == (short)*local_1c8)) {
                    local_1c8 = (ulong *)((long)local_1c8 + 2);
                    puVar40 = (uint *)((long)puVar40 + 2);
                  }
                  if (local_1c8 < puVar36) {
                    local_1c8 = (ulong *)((long)local_1c8 +
                                         (ulong)((BYTE)*puVar40 == (BYTE)*local_1c8));
                  }
                  local_1c8 = (ulong *)((long)local_1c8 - (long)ip);
                  goto LAB_0012de27;
                }
                lVar56 = lVar48 + uVar26 + 8;
                lVar48 = lVar48 + 8;
              } while (*(ulong *)(pBVar53 + lVar56) == *local_1c8);
              uVar50 = *local_1c8 ^ *(ulong *)(pBVar53 + lVar56);
              uVar26 = 0;
              if (uVar50 != 0) {
                for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              local_1c8 = (ulong *)((uVar26 >> 3 & 0x1fffffff) + lVar48);
            }
            else {
              uVar50 = *ip ^ *(ulong *)(pBVar53 + uVar26);
              uVar26 = 0;
              if (uVar50 != 0) {
                for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              local_1c8 = (ulong *)(uVar26 >> 3 & 0x1fffffff);
            }
LAB_0012de27:
            if (local_1c8 < (ulong *)0x3) goto LAB_0012ae64;
            if (uVar63 <= UVar54) {
LAB_0012e286:
              __assert_fail("current > matchIndex3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4806,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if ((int)local_248 != 0) {
LAB_0012e2a5:
              __assert_fail("mnum==0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4807,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            pZVar4->off = (uVar63 - UVar54) + 2;
            pZVar4->len = (U32)local_1c8;
            if ((local_1c8 <= (ulong *)(ulong)uVar45) &&
               (local_248 = 1, puVar29 = local_1c8, (ulong *)((long)ip + (long)local_1c8) != puVar36
               )) goto LAB_0012ae64;
            UVar54 = uVar63 + 1;
            local_248 = 1;
          }
          else {
LAB_0012ae64:
            local_1c8 = puVar29;
            pUVar30[uVar59] = uVar63;
            if ((uint)local_188 <= uVar49) {
              uVar45 = ~(-1 << ((byte)uVar41 & 0x1f));
              local_1b8 = ip + 1;
              puVar60 = (ulong *)0x0;
              puVar29 = (ulong *)0x0;
              do {
                puVar58 = puVar29;
                if (puVar60 < puVar29) {
                  puVar58 = puVar60;
                }
                if (uVar63 <= uVar49) goto LAB_0012e03a;
                uVar26 = (long)puVar58 + (ulong)uVar49;
                if (uVar26 < uVar44) goto LAB_0012e018;
                pBVar64 = pBVar53 + uVar49;
                if ((uVar44 <= uVar49) && (iVar39 = bcmp(pBVar64,ip,(size_t)puVar58), iVar39 != 0))
                goto LAB_0012e09d;
                puVar28 = (ulong *)((long)ip + (long)puVar58);
                puVar27 = (ulong *)(pBVar64 + (long)puVar58);
                puVar32 = puVar28;
                if (puVar28 < puVar1) {
                  if (*puVar27 == *puVar28) {
                    lVar48 = 0;
                    do {
                      puVar32 = (ulong *)((long)local_1b8 + (long)puVar58 + lVar48);
                      if (puVar1 <= puVar32) {
                        puVar27 = (ulong *)(pBVar53 + uVar26 + lVar48 + 8);
                        goto LAB_0012db7b;
                      }
                      lVar56 = lVar48 + uVar26 + 8;
                      lVar48 = lVar48 + 8;
                    } while (*(ulong *)(pBVar53 + lVar56) == *puVar32);
                    uVar50 = *puVar32 ^ *(ulong *)(pBVar53 + lVar56);
                    uVar26 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar48;
                  }
                  else {
                    uVar50 = *puVar28 ^ *puVar27;
                    uVar26 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = uVar26 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0012db7b:
                  if ((puVar32 < local_198) && ((uint)*puVar27 == (uint)*puVar32)) {
                    puVar32 = (ulong *)((long)puVar32 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar32 < local_1a0) && ((short)*puVar27 == (short)*puVar32)) {
                    puVar32 = (ulong *)((long)puVar32 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar32 < puVar36) {
                    puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar32));
                  }
                  uVar26 = (long)puVar32 - (long)puVar28;
                }
                puVar58 = (ulong *)(uVar26 + (long)puVar58);
                src = local_1b0;
                if (local_1c8 < puVar58) {
                  if (uVar47 < uVar49 || uVar47 - uVar49 == 0) goto LAB_0012e0bc;
                  if ((ulong *)(ulong)(uVar47 - uVar49) < puVar58) {
                    uVar47 = uVar49 + (U32)puVar58;
                  }
                  pZVar4[local_248].off = (uVar63 + 2) - uVar49;
                  pZVar4[local_248].len = (U32)puVar58;
                  local_248 = (ulong)((int)local_248 + 1);
                  if (((ulong *)0x1000 < puVar58) ||
                     (local_1c8 = puVar58, (ulong *)((long)ip + (long)puVar58) == puVar36)) break;
                }
                pUVar30 = local_130 + (uVar49 & (uint)local_158) * 2;
                if (pBVar64[(long)puVar58] < *(byte *)((long)ip + (long)puVar58)) {
                  *local_1d0 = uVar49;
                  if (uVar49 <= (uint)local_168) {
                    local_1d0 = (U32 *)local_1dc;
                    break;
                  }
                  pUVar30 = pUVar30 + 1;
                  puVar60 = puVar58;
                  puVar58 = puVar29;
                  local_1d0 = pUVar30;
                }
                else {
                  *local_238 = uVar49;
                  local_238 = pUVar30;
                  if (uVar49 <= (uint)local_168) {
                    local_238 = (U32 *)local_1dc;
                    break;
                  }
                }
                bVar65 = uVar45 == 0;
                uVar45 = uVar45 - 1;
                if (bVar65) break;
                uVar49 = *pUVar30;
                puVar29 = puVar58;
              } while ((uint)local_188 <= uVar49);
            }
            *local_238 = 0;
            *local_1d0 = 0;
            if (uVar47 <= (uint)local_1d8) goto LAB_0012e1a1;
            UVar54 = uVar47 - 8;
          }
          ms->nextToUpdate = UVar54;
          goto LAB_0012aeb0;
        }
        uVar26 = (ulong)((int)local_180 == 0);
        uVar45 = (ms->cParams).targetLength;
        if (0xffe < uVar45) {
          uVar45 = 0xfff;
        }
        pUVar30 = (U32 *)(ms->window).base;
        uVar59 = iVar39 - (int)pUVar30;
        uVar50 = (ulong)((uint)*ip * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
        uVar49 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        iVar39 = uVar59 - uVar49;
        local_248 = 0;
        if (uVar59 < uVar49) {
          iVar39 = 0;
        }
        local_168 = (ulong *)CONCAT44(local_168._4_4_,iVar39);
        uVar63 = (ms->window).lowLimit;
        uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar41 = uVar59 - uVar43;
        if (uVar59 - uVar63 <= uVar43) {
          uVar41 = uVar63;
        }
        local_130 = ms->chainTable;
        uVar43 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          uVar41 = uVar63;
        }
        uVar47 = uVar41 + (uVar41 == 0);
        local_188 = (uint *)CONCAT44(local_188._4_4_,uVar47);
        local_158 = CONCAT44(local_158._4_4_,uVar49);
        uVar46 = (ulong)((uVar49 & uVar59) * 2);
        local_230 = local_130 + uVar46;
        pUVar38 = local_130 + uVar46 + 1;
        local_1c8 = (ulong *)ms->hashTable;
        uVar63 = *(uint *)((long)local_1c8 + uVar50 * 4);
        local_1d8 = (ulong *)CONCAT44(local_1d8._4_4_,uVar59 + 8);
        uVar44 = uVar59 + 9;
        uVar49 = (ms->cParams).searchLog;
        uVar46 = uVar26 + 3;
        puVar60 = (ulong *)((long)ip + 4);
        puVar29 = local_118;
        do {
          if (uVar26 == 3) {
            UVar54 = (*local_150)[0] - 1;
          }
          else {
            UVar54 = (*local_150)[uVar26];
          }
          local_1d0 = pUVar30;
          if (uVar59 < uVar43) goto LAB_0012df55;
          if (UVar54 - 1 < uVar59 - uVar43) {
            if ((uint)*ip != *(uint *)((long)ip - (ulong)UVar54)) goto LAB_0012aa7c;
            lVar48 = -(ulong)UVar54;
            puVar58 = (ulong *)((long)puVar60 + lVar48);
            puVar28 = puVar60;
            if (puVar60 < puVar1) {
              if (*puVar58 == *puVar60) {
                lVar48 = lVar48 + 0xc;
                lVar56 = 0;
                do {
                  puVar28 = (ulong *)((long)ip + lVar56 + 0xc);
                  if (puVar1 <= puVar28) {
                    puVar58 = (ulong *)((long)ip + lVar56 + lVar48);
                    goto LAB_0012aa99;
                  }
                  uVar51 = *(ulong *)((long)ip + lVar56 + lVar48);
                  lVar56 = lVar56 + 8;
                } while (uVar51 == *puVar28);
                uVar51 = *puVar28 ^ uVar51;
                uVar37 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                uVar55 = ((uint)(uVar37 >> 3) & 0x1fffffff) + (int)lVar56;
              }
              else {
                uVar37 = *puVar60 ^ *puVar58;
                uVar51 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                  }
                }
                uVar55 = (uint)(uVar51 >> 3) & 0x1fffffff;
              }
            }
            else {
LAB_0012aa99:
              if ((puVar28 < local_198) && ((uint)*puVar58 == (uint)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 4);
                puVar58 = (ulong *)((long)puVar58 + 4);
              }
              if ((puVar28 < local_1a0) && ((short)*puVar58 == (short)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 2);
                puVar58 = (ulong *)((long)puVar58 + 2);
              }
              if (puVar28 < puVar36) {
                puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar58 == (BYTE)*puVar28));
              }
              uVar55 = (int)puVar28 - (int)puVar60;
            }
            puVar58 = (ulong *)(ulong)(uVar55 + 4);
          }
          else {
            if (uVar59 < uVar41) goto LAB_0012df77;
LAB_0012aa7c:
            puVar58 = (ulong *)0x0;
          }
          if (puVar29 < puVar58) {
            pZVar4[local_248].off = (int)uVar26 - (uint)((int)local_180 == 0);
            pZVar4[local_248].len = (uint)puVar58;
            local_248 = (ulong)((int)local_248 + 1);
            if ((uVar45 < (uint)puVar58) ||
               (puVar29 = puVar58, puVar36 = local_1c0,
               (ulong *)((long)ip + (long)puVar58) == local_1c0)) goto LAB_0012aeb0;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < uVar46);
        *(uint *)((long)local_1c8 + uVar50 * 4) = uVar59;
        if (uVar47 <= uVar63) {
          uVar45 = ~(-1 << ((byte)uVar49 & 0x1f));
          local_1b8 = ip + 1;
          puVar60 = (ulong *)0x0;
          puVar58 = (ulong *)0x0;
          do {
            puVar28 = puVar58;
            if (puVar60 < puVar58) {
              puVar28 = puVar60;
            }
            local_1c8 = puVar58;
            if (uVar59 <= uVar63) goto LAB_0012e03a;
            uVar26 = (long)puVar28 + (ulong)uVar63;
            if (uVar26 < uVar43) goto LAB_0012e018;
            pvVar62 = (void *)((ulong)uVar63 + (long)local_1d0);
            if ((uVar43 <= uVar63) && (iVar39 = bcmp(pvVar62,ip,(size_t)puVar28), iVar39 != 0))
            goto LAB_0012e09d;
            puVar58 = (ulong *)((long)ip + (long)puVar28);
            puVar27 = (ulong *)((long)pvVar62 + (long)puVar28);
            puVar32 = puVar58;
            if (puVar58 < puVar1) {
              if (*puVar27 == *puVar58) {
                lVar48 = 0;
                do {
                  puVar32 = (ulong *)((long)local_1b8 + (long)puVar28 + lVar48);
                  if (puVar1 <= puVar32) {
                    puVar27 = (ulong *)((long)pUVar30 + uVar26 + lVar48 + 8);
                    goto LAB_0012d8ee;
                  }
                  uVar50 = *(ulong *)((long)pUVar30 + lVar48 + uVar26 + 8);
                  lVar48 = lVar48 + 8;
                } while (uVar50 == *puVar32);
                uVar50 = *puVar32 ^ uVar50;
                uVar26 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar48;
              }
              else {
                uVar50 = *puVar58 ^ *puVar27;
                uVar26 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = uVar26 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0012d8ee:
              if ((puVar32 < local_198) && ((uint)*puVar27 == (uint)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar32 < local_1a0) && ((short)*puVar27 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar32 < puVar36) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar32));
              }
              uVar26 = (long)puVar32 - (long)puVar58;
            }
            puVar58 = (ulong *)(uVar26 + (long)puVar28);
            if (puVar29 < puVar58) {
              if (uVar44 < uVar63 || uVar44 - uVar63 == 0) goto LAB_0012e0bc;
              if ((ulong *)(ulong)(uVar44 - uVar63) < puVar58) {
                uVar44 = uVar63 + (U32)puVar58;
              }
              pZVar4[local_248].off = (uVar59 + 2) - uVar63;
              pZVar4[local_248].len = (U32)puVar58;
              local_248 = (ulong)((int)local_248 + 1);
              if (((ulong *)0x1000 < puVar58) ||
                 (puVar29 = puVar58, (ulong *)((long)ip + (long)puVar58) == puVar36)) break;
            }
            pUVar31 = local_130 + (uVar63 & (uint)local_158) * 2;
            if (*(byte *)((long)pvVar62 + (long)puVar58) < *(byte *)((long)ip + (long)puVar58)) {
              *local_230 = uVar63;
              if (uVar63 <= (uint)local_168) goto LAB_0012dd1f;
              pUVar31 = pUVar31 + 1;
              puVar60 = puVar58;
              puVar58 = local_1c8;
              local_230 = pUVar31;
            }
            else {
              *pUVar38 = uVar63;
              pUVar38 = pUVar31;
              if (uVar63 <= (uint)local_168) goto LAB_0012dd15;
            }
            bVar65 = uVar45 == 0;
            uVar45 = uVar45 - 1;
            if (bVar65) break;
            uVar63 = *pUVar31;
          } while ((uint)local_188 <= uVar63);
        }
      }
      goto LAB_0012ab73;
    }
    uVar26 = (ulong)(uint)((int)local_180 == 0);
    uVar45 = (ms->cParams).targetLength;
    if (0xffe < uVar45) {
      uVar45 = 0xfff;
    }
    pUVar30 = (U32 *)(ms->window).base;
    uVar49 = iVar39 - (int)pUVar30;
    local_1c8 = (ulong *)(*ip * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU));
    uVar59 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    iVar39 = uVar49 - uVar59;
    local_248 = 0;
    if (uVar49 < uVar59) {
      iVar39 = 0;
    }
    local_168 = (ulong *)CONCAT44(local_168._4_4_,iVar39);
    uVar63 = (ms->window).lowLimit;
    uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar41 = uVar49 - uVar43;
    if (uVar49 - uVar63 <= uVar43) {
      uVar41 = uVar63;
    }
    local_130 = ms->chainTable;
    uVar43 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      uVar41 = uVar63;
    }
    uVar47 = uVar41 + (uVar41 == 0);
    local_188 = (uint *)CONCAT44(local_188._4_4_,uVar47);
    local_158 = CONCAT44(local_158._4_4_,uVar59);
    uVar50 = (ulong)((uVar59 & uVar49) * 2);
    local_230 = local_130 + uVar50;
    pUVar38 = local_130 + uVar50 + 1;
    pUVar31 = ms->hashTable;
    uVar63 = pUVar31[(long)local_1c8];
    local_1d8 = (ulong *)CONCAT44(local_1d8._4_4_,uVar49 + 8);
    uVar44 = uVar49 + 9;
    uVar59 = (ms->cParams).searchLog;
    uVar50 = uVar26 + 3;
    puVar60 = (ulong *)((long)ip + 4);
    puVar29 = local_118;
    do {
      if (uVar26 == 3) {
        uVar55 = (*local_150)[0] - 1;
      }
      else {
        uVar55 = (*local_150)[uVar26];
      }
      local_1d0 = pUVar30;
      if (uVar49 < uVar43) {
LAB_0012df55:
        local_120 = pBVar64;
        __assert_fail("current >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x47d0,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (uVar55 - 1 < uVar49 - uVar43) {
        if ((uint)*ip == *(uint *)((long)ip - (ulong)uVar55)) {
          lVar48 = -(ulong)uVar55;
          puVar58 = (ulong *)((long)puVar60 + lVar48);
          puVar28 = puVar60;
          if (puVar60 < puVar1) {
            if (*puVar58 == *puVar60) {
              lVar48 = lVar48 + 0xc;
              lVar56 = 0;
              do {
                puVar28 = (ulong *)((long)ip + lVar56 + 0xc);
                if (puVar1 <= puVar28) {
                  puVar58 = (ulong *)((long)ip + lVar56 + lVar48);
                  goto LAB_0012a201;
                }
                uVar46 = *(ulong *)((long)ip + lVar56 + lVar48);
                lVar56 = lVar56 + 8;
              } while (uVar46 == *puVar28);
              uVar46 = *puVar28 ^ uVar46;
              uVar51 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                }
              }
              uVar55 = ((uint)(uVar51 >> 3) & 0x1fffffff) + (int)lVar56;
            }
            else {
              uVar51 = *puVar60 ^ *puVar58;
              uVar46 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              uVar55 = (uint)(uVar46 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_0012a201:
            if ((puVar28 < local_198) && ((uint)*puVar58 == (uint)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 4);
              puVar58 = (ulong *)((long)puVar58 + 4);
            }
            if ((puVar28 < local_1a0) && ((short)*puVar58 == (short)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 2);
              puVar58 = (ulong *)((long)puVar58 + 2);
            }
            if (puVar28 < puVar36) {
              puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar58 == (BYTE)*puVar28));
            }
            uVar55 = (int)puVar28 - (int)puVar60;
          }
          puVar58 = (ulong *)(ulong)(uVar55 + 4);
        }
        else {
          puVar58 = (ulong *)0x0;
        }
      }
      else {
        if (uVar49 < uVar41) {
LAB_0012df77:
          local_120 = pBVar64;
          __assert_fail("current >= windowLow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x47d9,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        puVar58 = (ulong *)0x0;
      }
      if (puVar29 < puVar58) {
        pZVar4[local_248].off = (int)uVar26 - (uint)((int)local_180 == 0);
        pZVar4[local_248].len = (uint)puVar58;
        local_248 = (ulong)((int)local_248 + 1);
        if ((uVar45 < (uint)puVar58) ||
           (puVar29 = puVar58, puVar36 = local_1c0, (ulong *)((long)ip + (long)puVar58) == local_1c0
           )) goto LAB_0012aeb0;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < uVar50);
    pUVar31[(long)local_1c8] = uVar49;
    if (uVar47 <= uVar63) {
      uVar45 = ~(-1 << ((byte)uVar59 & 0x1f));
      local_1b8 = ip + 1;
      puVar60 = (ulong *)0x0;
      puVar58 = (ulong *)0x0;
      do {
        puVar28 = puVar58;
        if (puVar60 < puVar58) {
          puVar28 = puVar60;
        }
        local_1c8 = puVar58;
        if (uVar49 <= uVar63) {
LAB_0012e03a:
          __assert_fail("current > matchIndex",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4819,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar26 = (long)puVar28 + (ulong)uVar63;
        if (uVar26 < uVar43) {
LAB_0012e018:
          __assert_fail("matchIndex+matchLength >= dictLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x481c,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        pvVar62 = (void *)((ulong)uVar63 + (long)local_1d0);
        if ((uVar43 <= uVar63) && (iVar39 = bcmp(pvVar62,ip,(size_t)puVar28), iVar39 != 0)) {
LAB_0012e09d:
          __assert_fail("memcmp(match, ip, matchLength) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x481e,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        puVar58 = (ulong *)((long)ip + (long)puVar28);
        puVar27 = (ulong *)((long)pvVar62 + (long)puVar28);
        puVar32 = puVar58;
        if (puVar58 < puVar1) {
          if (*puVar27 == *puVar58) {
            lVar48 = 0;
            do {
              puVar32 = (ulong *)((long)local_1b8 + (long)puVar28 + lVar48);
              if (puVar1 <= puVar32) {
                puVar27 = (ulong *)((long)pUVar30 + uVar26 + lVar48 + 8);
                goto LAB_0012aced;
              }
              uVar50 = *(ulong *)((long)pUVar30 + lVar48 + uVar26 + 8);
              lVar48 = lVar48 + 8;
            } while (uVar50 == *puVar32);
            uVar50 = *puVar32 ^ uVar50;
            uVar26 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar48;
          }
          else {
            uVar50 = *puVar58 ^ *puVar27;
            uVar26 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = uVar26 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0012aced:
          if ((puVar32 < local_198) && ((uint)*puVar27 == (uint)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 4);
            puVar27 = (ulong *)((long)puVar27 + 4);
          }
          if ((puVar32 < local_1a0) && ((short)*puVar27 == (short)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 2);
            puVar27 = (ulong *)((long)puVar27 + 2);
          }
          if (puVar32 < puVar36) {
            puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar32));
          }
          uVar26 = (long)puVar32 - (long)puVar58;
        }
        puVar58 = (ulong *)(uVar26 + (long)puVar28);
        if (puVar29 < puVar58) {
          if (uVar44 < uVar63 || uVar44 - uVar63 == 0) {
LAB_0012e0bc:
            __assert_fail("matchEndIdx > matchIndex",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x482b,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if ((ulong *)(ulong)(uVar44 - uVar63) < puVar58) {
            uVar44 = uVar63 + (U32)puVar58;
          }
          pZVar4[local_248].off = (uVar49 + 2) - uVar63;
          pZVar4[local_248].len = (U32)puVar58;
          local_248 = (ulong)((int)local_248 + 1);
          if (((ulong *)0x1000 < puVar58) ||
             (puVar29 = puVar58, (ulong *)((long)ip + (long)puVar58) == puVar36)) break;
        }
        pUVar31 = local_130 + (uVar63 & (uint)local_158) * 2;
        if (*(byte *)((long)pvVar62 + (long)puVar58) < *(byte *)((long)ip + (long)puVar58)) {
          *local_230 = uVar63;
          if (uVar63 <= (uint)local_168) {
            local_230 = (U32 *)local_1dc;
            break;
          }
          pUVar31 = pUVar31 + 1;
          puVar60 = puVar58;
          puVar58 = local_1c8;
          local_230 = pUVar31;
        }
        else {
          *pUVar38 = uVar63;
          pUVar38 = pUVar31;
          if (uVar63 <= (uint)local_168) {
            pUVar38 = (U32 *)local_1dc;
            break;
          }
        }
        bVar65 = uVar45 == 0;
        uVar45 = uVar45 - 1;
        if (bVar65) break;
        uVar63 = *pUVar31;
      } while ((uint)local_188 <= uVar63);
    }
    src = local_1b0;
    *pUVar38 = 0;
    *local_230 = 0;
    if (uVar44 <= (uint)local_1d8) goto LAB_0012e1a1;
    ms->nextToUpdate = uVar44 - 8;
    goto LAB_0012aeb0;
  }
  goto LAB_0012af39;
LAB_0012dd15:
  pUVar38 = (U32 *)local_1dc;
  goto LAB_0012ab73;
LAB_0012dd1f:
  local_230 = (U32 *)local_1dc;
LAB_0012ab73:
  *pUVar38 = 0;
  *local_230 = 0;
  if (uVar44 <= (uint)local_1d8) {
LAB_0012e1a1:
    __assert_fail("matchEndIdx > current+8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4873,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  ms->nextToUpdate = uVar44 - 8;
  src = local_1b0;
LAB_0012aeb0:
  pZVar61 = local_108;
  poVar22 = local_110;
  if ((int)local_248 == 0) {
LAB_0012af39:
    ip = (ulong *)((long)ip + 1);
    goto LAB_0012d798;
  }
  lVar48 = 0;
  do {
    local_108->rep[lVar48] = (*local_150)[lVar48];
    lVar48 = lVar48 + 1;
  } while (lVar48 != 3);
  local_108->mlen = 0;
  local_108->litlen = (U32)local_180;
  UVar54 = ZSTD_litLengthPrice((U32)local_180,local_110,2);
  pZVar61->price = UVar54;
  uVar45 = pZVar4[(int)local_248 - 1U].len;
  if (local_100 < uVar45) {
    UVar23 = pZVar4[(int)local_248 - 1U].off;
LAB_0012d407:
    uVar26 = 0;
  }
  else {
    UVar23 = ZSTD_litLengthPrice(0,poVar22,2);
    uVar26 = 0;
    pZVar35 = local_b8;
    do {
      auVar66._8_8_ = uVar26;
      auVar66._0_8_ = uVar26;
      auVar66._16_8_ = uVar26;
      auVar66._24_8_ = uVar26;
      auVar9 = vpor_avx2(auVar66,_DAT_001b2020);
      auVar6._8_8_ = uStack_c0;
      auVar6._0_8_ = local_c8;
      auVar7._8_8_ = uStack_90;
      auVar7._0_8_ = local_98;
      auVar6 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar6,auVar6 ^ auVar7);
      auVar6 = vpackssdw_avx(auVar6,auVar6);
      auVar6 = vpackssdw_avx(auVar6 ^ _DAT_001b5b00,auVar6 ^ _DAT_001b5b00);
      if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar35[-7].price = 0x40000000;
      }
      auVar11._8_8_ = uStack_c0;
      auVar11._0_8_ = local_c8;
      auVar14._8_8_ = uStack_90;
      auVar14._0_8_ = local_98;
      auVar7 = auVar9._0_16_ ^ auVar11;
      auVar6 = vpcmpgtq_avx(auVar7,auVar11 ^ auVar14);
      auVar6 = vpackssdw_avx(auVar6,auVar6);
      auVar7 = vpcmpeqd_avx(auVar7,auVar7);
      auVar6 = vpackssdw_avx(auVar6 ^ auVar7,auVar6 ^ auVar7);
      if ((auVar6 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar35[-6].price = 0x40000000;
      }
      auVar18._8_8_ = uStack_50;
      auVar18._0_8_ = local_58;
      auVar18._16_8_ = uStack_48;
      auVar18._24_8_ = uStack_40;
      auVar8._8_8_ = uStack_70;
      auVar8._0_8_ = local_78;
      auVar8._16_8_ = uStack_68;
      auVar8._24_8_ = uStack_60;
      auVar8 = vpcmpgtq_avx2(auVar9 ^ auVar18,auVar8);
      auVar9 = vpackssdw_avx2(auVar8,auVar66);
      auVar6 = auVar9._16_16_ ^ auVar7;
      auVar6 = vpackssdw_avx(auVar6,auVar6);
      if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar35[-5].price = 0x40000000;
      }
      auVar9 = vpackssdw_avx2(auVar8,auVar66);
      auVar6 = auVar9._16_16_ ^ auVar7;
      auVar6 = vpackssdw_avx(auVar6,auVar6);
      if ((auVar6 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar35[-4].price = 0x40000000;
      }
      auVar9 = vpor_avx2(auVar66,_DAT_001b3700);
      auVar12._8_8_ = uStack_c0;
      auVar12._0_8_ = local_c8;
      auVar15._8_8_ = uStack_90;
      auVar15._0_8_ = local_98;
      auVar6 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar12,auVar12 ^ auVar15);
      auVar6 = vpackssdw_avx(auVar6,auVar6);
      auVar6 = vpackssdw_avx(auVar6 ^ auVar7,auVar6 ^ auVar7);
      if ((auVar6 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar35[-3].price = 0x40000000;
      }
      auVar13._8_8_ = uStack_c0;
      auVar13._0_8_ = local_c8;
      auVar16._8_8_ = uStack_90;
      auVar16._0_8_ = local_98;
      auVar6 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar13,auVar13 ^ auVar16);
      auVar6 = vpackssdw_avx(auVar6,auVar6);
      auVar6 = vpackssdw_avx(auVar6 ^ auVar7,auVar6 ^ auVar7);
      if ((auVar6 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar35[-2].price = 0x40000000;
      }
      auVar19._8_8_ = uStack_50;
      auVar19._0_8_ = local_58;
      auVar19._16_8_ = uStack_48;
      auVar19._24_8_ = uStack_40;
      auVar17._8_8_ = uStack_70;
      auVar17._0_8_ = local_78;
      auVar17._16_8_ = uStack_68;
      auVar17._24_8_ = uStack_60;
      auVar66 = vpcmpgtq_avx2(auVar9 ^ auVar19,auVar17);
      auVar9 = vpackssdw_avx2(auVar66,auVar66);
      auVar6 = auVar9._16_16_ ^ auVar7;
      auVar6 = vpackssdw_avx(auVar6,auVar6);
      if ((auVar6 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar35[-1].price = 0x40000000;
      }
      auVar9 = vpshufhw_avx2(auVar66,0x84);
      auVar7 = auVar9._16_16_ ^ auVar7;
      auVar6 = vpackssdw_avx(auVar7,auVar7);
      if ((auVar6 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar35->price = 0x40000000;
      }
      uVar26 = uVar26 + 8;
      pZVar35 = pZVar35 + 8;
    } while (local_a8 != uVar26);
    uVar50 = 0;
    uVar26 = local_e0;
    do {
      uVar45 = pZVar4[uVar50].len;
      if ((uint)uVar26 <= uVar45) {
        UVar24 = pZVar4[uVar50].off;
        if (UVar24 == 0xffffffff) {
LAB_0012def2:
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x12c2,"U32 ZSTD_highbit32(U32)");
        }
        uVar49 = 0x1f;
        if (UVar24 + 1 != 0) {
          for (; UVar24 + 1 >> uVar49 == 0; uVar49 = uVar49 - 1) {
          }
        }
        uVar59 = (uint)uVar26 * 0x100 - 0x200;
        do {
          uVar63 = (uint)uVar26;
          if (uVar63 < 3) {
LAB_0012df14:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x469f,
                          "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                         );
          }
          if ((ms->opt).priceType == zop_predef) {
            uVar41 = 0x1f;
            if (uVar63 - 2 != 0) {
              for (; uVar63 - 2 >> uVar41 == 0; uVar41 = uVar41 - 1) {
              }
            }
            if (0x16 < uVar41) goto LAB_0012ded0;
            iVar39 = (uVar41 + uVar49) * 0x100 + (uVar59 >> ((byte)uVar41 & 0x1f)) + 0x1000;
          }
          else {
            uVar41 = (ms->opt).offCodeFreq[uVar49] + 1;
            if (uVar41 == 0) goto LAB_0012def2;
            uVar43 = 0x1f;
            if (uVar41 != 0) {
              for (; uVar41 >> uVar43 == 0; uVar43 = uVar43 - 1) {
              }
            }
            if (0x16 < uVar43) {
LAB_0012ded0:
              __assert_fail("hb + BITCOST_ACCURACY < 31",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x45cb,"U32 ZSTD_fracWeight(U32)");
            }
            uVar44 = uVar63 - 3;
            if (uVar44 < 0x80) {
              uVar44 = (uint)(byte)ZSTD_MLcode(unsigned_int)::ML_Code[uVar44];
            }
            else {
              uVar47 = 0x1f;
              if (uVar44 != 0) {
                for (; uVar44 >> uVar47 == 0; uVar47 = uVar47 - 1) {
                }
              }
              uVar44 = (uVar47 ^ 0xffffffe0) + 0x44;
            }
            uVar47 = (ms->opt).matchLengthFreq[uVar44] + 1;
            if (uVar47 == 0) goto LAB_0012def2;
            uVar55 = 0x1f;
            if (uVar47 != 0) {
              for (; uVar47 >> uVar55 == 0; uVar55 = uVar55 - 1) {
              }
            }
            if (0x16 < uVar55) goto LAB_0012ded0;
            iVar39 = (((ms->opt).matchLengthSumBasePrice + (ms->opt).offCodeSumBasePrice) -
                     ((uVar41 * 0x100 >> ((byte)uVar43 & 0x1f)) +
                     (uVar47 * 0x100 >> ((byte)uVar55 & 0x1f)))) +
                     ((ML_bits[uVar44] + uVar49) - (uVar43 + uVar55)) * 0x100 + 0x33;
            pZVar61 = local_108;
          }
          uVar26 = uVar26 & 0xffffffff;
          pZVar61[uVar26].mlen = uVar63;
          pZVar61[uVar26].off = UVar24;
          pZVar61[uVar26].litlen = (U32)local_180;
          pZVar61[uVar26].price = iVar39 + UVar23 + UVar54;
          uVar26 = (ulong)(uVar63 + 1);
          uVar59 = uVar59 + 0x100;
        } while (uVar63 + 1 <= uVar45);
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 != local_248);
    uVar50 = 0;
    uVar45 = (int)uVar26 - 1;
    if (uVar45 != 0) {
      local_1c8 = (ulong *)((long)ip + 0xd);
      local_158 = (long)ip + 9;
      local_188 = (uint *)((long)ip + 0xc);
      uVar50 = (ulong)uVar45;
      uVar26 = 1;
      local_168 = ip;
      do {
        poVar22 = local_110;
        if (uVar26 == 0x1000) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4928,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        pZVar35 = pZVar61 + uVar26;
        UVar54 = 1;
        if (pZVar61[uVar26 - 1].mlen == 0) {
          UVar54 = pZVar35[-1].litlen + 1;
        }
        puVar36 = (ulong *)((long)ip + uVar26);
        local_180 = CONCAT44(local_180._4_4_,pZVar35[-1].price);
        iVar25 = (int)puVar36;
        UVar23 = ZSTD_rawLiteralsCost
                           ((BYTE *)((long)puVar36 + -1),(U32)local_110,(optState_t *)0x2,iVar25);
        UVar24 = ZSTD_litLengthPrice(UVar54,poVar22,2);
        iVar39 = UVar24 + UVar23 + (int)local_180;
        UVar23 = ZSTD_litLengthPrice(UVar54 - 1,poVar22,2);
        pZVar61 = local_108;
        iVar39 = iVar39 - UVar23;
        if (999999999 < iVar39) {
          __assert_fail("price < 1000000000",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4931,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        iVar3 = local_108[uVar26].price;
        iVar33 = (int)uVar26;
        if (iVar3 < iVar39) {
          uVar45 = pZVar35->mlen;
          if (uVar26 < uVar45) {
            __assert_fail("cur >= opt[cur].mlen",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4947,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          local_130 = &pZVar35->mlen;
          iVar39 = iVar3;
          if (uVar45 == 0) goto LAB_0012b458;
          rVar67 = ZSTD_updateRep(local_108[iVar33 - uVar45].rep,pZVar35->off,
                                  (uint)(pZVar35->litlen == 0));
          *&pZVar35->rep = rVar67.rep;
          uVar45 = 1;
          bVar65 = false;
        }
        else {
          pZVar35->off = 0;
          pZVar35->mlen = 0;
          pZVar35->litlen = UVar54;
          pZVar35->price = iVar39;
LAB_0012b458:
          local_130 = &pZVar35->mlen;
          pZVar35->rep[2] = pZVar35[-1].rep[2];
          *(undefined8 *)pZVar35->rep = *(undefined8 *)pZVar35[-1].rep;
          bVar65 = true;
          uVar45 = 0;
        }
        if (puVar36 <= local_e8) {
          if (uVar26 == (uVar50 & 0xffffffff)) break;
          local_180 = 0;
          if (bVar65) {
            local_180 = (ulong)pZVar35->litlen;
          }
          UVar54 = ZSTD_litLengthPrice(0,local_110,2);
          pBVar64 = (ms->window).base;
          uVar46 = (ulong)ms->nextToUpdate;
          if (pBVar64 + uVar46 <= puVar36) {
            UVar23 = (ms->cParams).minMatch;
            while( true ) {
              uVar59 = (uint)uVar46;
              uVar49 = (uint)((long)puVar36 - (long)pBVar64);
              if (uVar49 <= uVar59) break;
              UVar24 = ZSTD_insertBt1(ms,pBVar64 + uVar46,(BYTE *)local_1c0,UVar23,0);
              uVar46 = (ulong)(UVar24 + uVar59);
              if (UVar24 + uVar59 <= uVar59) goto LAB_0012df36;
            }
            if ((ulong)((long)puVar36 - (long)pBVar64) >> 0x20 != 0) goto LAB_0012e160;
            if ((ulong)((long)local_1c0 - (long)pBVar64) >> 0x20 != 0) goto LAB_0012e13e;
            ms->nextToUpdate = uVar49;
            if (UVar23 - 6 < 2) {
              uVar49 = (ms->cParams).targetLength;
              if (0xffe < uVar49) {
                uVar49 = 0xfff;
              }
              pBVar64 = (ms->window).base;
              uVar59 = iVar25 - (int)pBVar64;
              local_1d0 = (U32 *)(ulong)uVar59;
              uVar46 = *puVar36 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
              local_18c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar25 = uVar59 - local_18c;
              local_238 = (U32 *)0x0;
              if (uVar59 < local_18c) {
                iVar25 = 0;
              }
              local_140 = (U32 *)CONCAT44(local_140._4_4_,iVar25);
              uVar63 = (ms->window).lowLimit;
              uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar41 = uVar59 - uVar43;
              if (uVar59 - uVar63 <= uVar43) {
                uVar41 = uVar63;
              }
              local_160 = ms->chainTable;
              uVar43 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar41 = uVar63;
              }
              uVar55 = uVar41 + (uVar41 == 0);
              local_138 = (BYTE *)CONCAT44(local_138._4_4_,uVar55);
              uVar51 = (ulong)((local_18c & uVar59) * 2);
              local_178 = (ulong *)(local_160 + uVar51);
              puVar29 = (ulong *)(local_160 + uVar51 + 1);
              uVar37 = (ulong)uVar45;
              pUVar30 = ms->hashTable;
              uVar44 = pUVar30[uVar46];
              local_f0 = uVar59 + 8;
              uVar47 = uVar59 + 9;
              local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar47);
              uVar63 = (ms->cParams).searchLog;
              local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,uVar63);
              uVar51 = uVar37 + 3;
              puVar60 = (ulong *)((long)puVar36 + 4);
              local_220 = local_118;
              do {
                if (uVar37 == 3) {
                  UVar23 = pZVar35->rep[0] - 1;
                }
                else {
                  UVar23 = pZVar35->rep[uVar37];
                }
                local_1d8 = puVar29;
                if (uVar59 < uVar43) goto LAB_0012df55;
                if (UVar23 - 1 < uVar59 - uVar43) {
                  if ((uint)*puVar36 == *(uint *)((long)puVar36 - (ulong)UVar23)) {
                    lVar48 = -(ulong)UVar23;
                    puVar58 = (ulong *)((long)puVar60 + lVar48);
                    puVar28 = puVar60;
                    if (puVar60 < puVar1) {
                      if (*puVar58 == *puVar60) {
                        lVar56 = 0;
                        do {
                          puVar28 = (ulong *)((long)local_1c8 + lVar56);
                          if (puVar1 <= puVar28) {
                            puVar58 = (ulong *)(lVar48 + (long)puVar28);
                            goto LAB_0012bb6d;
                          }
                          uVar52 = *(ulong *)((long)local_1c8 + lVar56 + lVar48);
                          lVar56 = lVar56 + 8;
                        } while (uVar52 == *puVar28);
                        uVar52 = *puVar28 ^ uVar52;
                        uVar57 = 0;
                        if (uVar52 != 0) {
                          for (; (uVar52 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                          }
                        }
                        uVar34 = ((uint)(uVar57 >> 3) & 0x1fffffff) + (int)lVar56;
                      }
                      else {
                        uVar57 = *puVar60 ^ *puVar58;
                        uVar52 = 0;
                        if (uVar57 != 0) {
                          for (; (uVar57 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                          }
                        }
                        uVar34 = (uint)(uVar52 >> 3) & 0x1fffffff;
                      }
                    }
                    else {
LAB_0012bb6d:
                      if ((puVar28 < local_198) && ((uint)*puVar58 == (uint)*puVar28)) {
                        puVar28 = (ulong *)((long)puVar28 + 4);
                        puVar58 = (ulong *)((long)puVar58 + 4);
                      }
                      if ((puVar28 < local_1a0) && ((short)*puVar58 == (short)*puVar28)) {
                        puVar28 = (ulong *)((long)puVar28 + 2);
                        puVar58 = (ulong *)((long)puVar58 + 2);
                      }
                      if (puVar28 < local_1c0) {
                        puVar28 = (ulong *)((long)puVar28 +
                                           (ulong)((BYTE)*puVar58 == (BYTE)*puVar28));
                      }
                      uVar34 = (int)puVar28 - (int)puVar60;
                    }
                    uVar34 = uVar34 + 4;
                  }
                  else {
                    uVar34 = 0;
                  }
                }
                else {
                  if (uVar59 < uVar41) goto LAB_0012df77;
                  uVar34 = 0;
                }
                puVar58 = (ulong *)(ulong)uVar34;
                if (local_220 < puVar58) {
                  pZVar4[(long)local_238].off = (int)uVar37 - uVar45;
                  pZVar4[(long)local_238].len = uVar34;
                  local_238 = (U32 *)(ulong)((int)local_238 + 1);
                  if ((uVar49 < uVar34) ||
                     (local_220 = puVar58, (ulong *)((long)puVar36 + (long)puVar58) == local_1c0))
                  goto LAB_0012ce7a;
                }
                uVar37 = uVar37 + 1;
              } while (uVar37 < uVar51);
              pUVar30[uVar46] = uVar59;
              local_120 = pBVar64;
              if (uVar55 <= uVar44) {
                uVar45 = ~(-1 << ((byte)uVar63 & 0x1f));
                local_148 = (U32 *)CONCAT44(local_148._4_4_,uVar59 + 2);
                local_128 = pBVar64 + 8;
                puVar60 = (ulong *)0x0;
                local_1b8 = (ulong *)0x0;
                do {
                  puVar58 = local_1b8;
                  if (puVar60 < local_1b8) {
                    puVar58 = puVar60;
                  }
                  local_170 = puVar60;
                  if ((uint)local_1d0 <= uVar44) goto LAB_0012e03a;
                  uVar46 = (ulong)uVar44 + (long)puVar58;
                  if (uVar46 < uVar43) goto LAB_0012e018;
                  pBVar53 = pBVar64 + uVar44;
                  if (uVar43 <= uVar44) {
                    local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar47);
                    local_1d8 = puVar29;
                    iVar25 = bcmp(pBVar53,puVar36,(size_t)puVar58);
                    puVar29 = local_1d8;
                    pBVar64 = local_120;
                    uVar47 = (uint)local_1a8;
                    if (iVar25 != 0) goto LAB_0012e09d;
                  }
                  puVar60 = (ulong *)((long)puVar36 + (long)puVar58);
                  puVar28 = (ulong *)(pBVar53 + (long)puVar58);
                  puVar27 = puVar60;
                  if (puVar60 < puVar1) {
                    if (*puVar28 == *puVar60) {
                      lVar48 = 0;
                      do {
                        puVar27 = (ulong *)((long)puVar58 + lVar48 + local_158);
                        local_1d8 = puVar29;
                        if (puVar1 <= puVar27) {
                          puVar28 = (ulong *)(local_128 + uVar46 + lVar48);
                          goto LAB_0012c4e9;
                        }
                        lVar56 = lVar48 + uVar46;
                        lVar48 = lVar48 + 8;
                      } while (*(ulong *)(local_128 + lVar56) == *puVar27);
                      uVar51 = *puVar27 ^ *(ulong *)(local_128 + lVar56);
                      uVar46 = 0;
                      if (uVar51 != 0) {
                        for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                        }
                      }
                      uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar48;
                    }
                    else {
                      uVar51 = *puVar60 ^ *puVar28;
                      uVar46 = 0;
                      if (uVar51 != 0) {
                        for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                        }
                      }
                      uVar46 = uVar46 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0012c4e9:
                    if ((puVar27 < local_198) && ((uint)*puVar28 == (uint)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 4);
                      puVar28 = (ulong *)((long)puVar28 + 4);
                    }
                    if ((puVar27 < local_1a0) && ((short)*puVar28 == (short)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 2);
                      puVar28 = (ulong *)((long)puVar28 + 2);
                    }
                    if (puVar27 < local_1c0) {
                      puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar27))
                      ;
                    }
                    uVar46 = (long)puVar27 - (long)puVar60;
                  }
                  puVar58 = (ulong *)(uVar46 + (long)puVar58);
                  if (local_220 < puVar58) {
                    if (uVar47 < uVar44 || uVar47 - uVar44 == 0) goto LAB_0012e0bc;
                    if ((ulong *)(ulong)(uVar47 - uVar44) < puVar58) {
                      uVar47 = uVar44 + (U32)puVar58;
                    }
                    pZVar4[(long)local_238].off = (int)local_148 - uVar44;
                    pZVar4[(long)local_238].len = (U32)puVar58;
                    local_238 = (U32 *)(ulong)((int)local_238 + 1);
                    if (((ulong *)0x1000 < puVar58) ||
                       (local_220 = puVar58, (ulong *)((long)puVar36 + (long)puVar58) == local_1c0))
                    break;
                  }
                  puVar28 = (ulong *)(local_160 + (uVar44 & local_18c) * 2);
                  if (pBVar53[(long)puVar58] < *(byte *)((long)puVar36 + (long)puVar58)) {
                    *(uint *)local_178 = uVar44;
                    if (uVar44 <= (uint)local_140) {
                      local_178 = (ulong *)local_1dc;
                      break;
                    }
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar60 = puVar58;
                    local_178 = puVar28;
                  }
                  else {
                    *(uint *)puVar29 = uVar44;
                    puVar29 = puVar28;
                    puVar60 = local_170;
                    local_1b8 = puVar58;
                    if (uVar44 <= (uint)local_140) {
                      puVar29 = (ulong *)local_1dc;
                      break;
                    }
                  }
                  bVar65 = uVar45 == 0;
                  uVar45 = uVar45 - 1;
                  if (bVar65) break;
                  uVar44 = (uint)*puVar28;
                } while ((uint)local_138 <= uVar44);
              }
              *(uint *)puVar29 = 0;
              *(uint *)local_178 = 0;
              if (uVar47 <= local_f0) goto LAB_0012e1a1;
              ms->nextToUpdate = uVar47 - 8;
              pBVar64 = local_120;
            }
            else {
              pBVar64 = local_120;
              if (UVar23 == 5) {
                uVar49 = (ms->cParams).targetLength;
                if (0xffe < uVar49) {
                  uVar49 = 0xfff;
                }
                local_138 = (ms->window).base;
                uVar59 = iVar25 - (int)local_138;
                local_1d0 = (U32 *)(ulong)uVar59;
                uVar46 = *puVar36 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
                local_18c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                iVar25 = uVar59 - local_18c;
                local_238 = (U32 *)0x0;
                if (uVar59 < local_18c) {
                  iVar25 = 0;
                }
                local_140 = (U32 *)CONCAT44(local_140._4_4_,iVar25);
                uVar63 = (ms->window).lowLimit;
                uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                uVar41 = uVar59 - uVar43;
                if (uVar59 - uVar63 <= uVar43) {
                  uVar41 = uVar63;
                }
                local_160 = ms->chainTable;
                uVar43 = (ms->window).dictLimit;
                if (ms->loadedDictEnd != 0) {
                  uVar41 = uVar63;
                }
                uVar55 = uVar41 + (uVar41 == 0);
                local_178 = (ulong *)CONCAT44(local_178._4_4_,uVar55);
                uVar51 = (ulong)((local_18c & uVar59) * 2);
                local_1a8 = (ulong *)(local_160 + uVar51);
                local_210 = (ulong *)(local_160 + uVar51 + 1);
                uVar37 = (ulong)uVar45;
                local_1d8 = (ulong *)ms->hashTable;
                uVar44 = *(uint *)((long)local_1d8 + uVar46 * 4);
                local_128 = (BYTE *)CONCAT44(local_128._4_4_,uVar59 + 8);
                uVar47 = uVar59 + 9;
                local_170 = (ulong *)CONCAT44(local_170._4_4_,uVar47);
                uVar63 = (ms->cParams).searchLog;
                local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,uVar63);
                uVar51 = uVar37 + 3;
                puVar60 = (ulong *)((long)puVar36 + 4);
                local_220 = local_118;
                do {
                  if (uVar37 == 3) {
                    UVar23 = pZVar35->rep[0] - 1;
                  }
                  else {
                    UVar23 = pZVar35->rep[uVar37];
                  }
                  if (uVar59 < uVar43) goto LAB_0012df55;
                  if (UVar23 - 1 < uVar59 - uVar43) {
                    if ((uint)*puVar36 == *(uint *)((long)puVar36 - (ulong)UVar23)) {
                      lVar48 = -(ulong)UVar23;
                      puVar29 = (ulong *)((long)puVar60 + lVar48);
                      puVar58 = puVar60;
                      if (puVar60 < puVar1) {
                        if (*puVar29 == *puVar60) {
                          lVar56 = 0;
                          do {
                            puVar58 = (ulong *)((long)local_1c8 + lVar56);
                            if (puVar1 <= puVar58) {
                              puVar29 = (ulong *)(lVar48 + (long)puVar58);
                              goto LAB_0012becc;
                            }
                            uVar52 = *(ulong *)((long)local_1c8 + lVar56 + lVar48);
                            lVar56 = lVar56 + 8;
                          } while (uVar52 == *puVar58);
                          uVar52 = *puVar58 ^ uVar52;
                          uVar57 = 0;
                          if (uVar52 != 0) {
                            for (; (uVar52 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                            }
                          }
                          uVar34 = ((uint)(uVar57 >> 3) & 0x1fffffff) + (int)lVar56;
                        }
                        else {
                          uVar57 = *puVar60 ^ *puVar29;
                          uVar52 = 0;
                          if (uVar57 != 0) {
                            for (; (uVar57 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                            }
                          }
                          uVar34 = (uint)(uVar52 >> 3) & 0x1fffffff;
                        }
                      }
                      else {
LAB_0012becc:
                        if ((puVar58 < local_198) && ((uint)*puVar29 == (uint)*puVar58)) {
                          puVar58 = (ulong *)((long)puVar58 + 4);
                          puVar29 = (ulong *)((long)puVar29 + 4);
                        }
                        if ((puVar58 < local_1a0) && ((short)*puVar29 == (short)*puVar58)) {
                          puVar58 = (ulong *)((long)puVar58 + 2);
                          puVar29 = (ulong *)((long)puVar29 + 2);
                        }
                        if (puVar58 < local_1c0) {
                          puVar58 = (ulong *)((long)puVar58 +
                                             (ulong)((BYTE)*puVar29 == (BYTE)*puVar58));
                        }
                        uVar34 = (int)puVar58 - (int)puVar60;
                      }
                      uVar34 = uVar34 + 4;
                    }
                    else {
                      uVar34 = 0;
                    }
                  }
                  else {
                    if (uVar59 < uVar41) goto LAB_0012df77;
                    uVar34 = 0;
                  }
                  puVar29 = (ulong *)(ulong)uVar34;
                  if (local_220 < puVar29) {
                    pZVar4[(long)local_238].off = (int)uVar37 - uVar45;
                    pZVar4[(long)local_238].len = uVar34;
                    local_238 = (U32 *)(ulong)((int)local_238 + 1);
                    if ((uVar49 < uVar34) ||
                       (local_220 = puVar29, (ulong *)((long)puVar36 + (long)puVar29) == local_1c0))
                    goto LAB_0012ce7a;
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 < uVar51);
                *(uint *)((long)local_1d8 + uVar46 * 4) = uVar59;
                if (uVar55 <= uVar44) {
                  uVar45 = ~(-1 << ((byte)uVar63 & 0x1f));
                  local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar59 + 2);
                  local_148 = (U32 *)(local_138 + 8);
                  local_1d8 = (ulong *)0x0;
                  local_1e8 = (ulong *)0x0;
                  do {
                    puVar60 = local_1e8;
                    if (local_1d8 < local_1e8) {
                      puVar60 = local_1d8;
                    }
                    if ((uint)local_1d0 <= uVar44) goto LAB_0012e03a;
                    uVar46 = (ulong)uVar44 + (long)puVar60;
                    if (uVar46 < uVar43) goto LAB_0012e018;
                    puVar29 = (ulong *)(local_138 + uVar44);
                    if (uVar43 <= uVar44) {
                      local_170 = (ulong *)CONCAT44(local_170._4_4_,uVar47);
                      local_1b8 = puVar29;
                      iVar25 = bcmp(puVar29,puVar36,(size_t)puVar60);
                      puVar29 = local_1b8;
                      uVar47 = (uint)local_170;
                      if (iVar25 != 0) goto LAB_0012e09d;
                    }
                    puVar58 = (ulong *)((long)puVar36 + (long)puVar60);
                    puVar28 = (ulong *)((long)puVar29 + (long)puVar60);
                    puVar27 = puVar58;
                    if (puVar58 < puVar1) {
                      if (*puVar28 == *puVar58) {
                        lVar48 = 0;
                        do {
                          puVar27 = (ulong *)((long)puVar60 + lVar48 + local_158);
                          if (puVar1 <= puVar27) {
                            puVar28 = (ulong *)((long)local_148 + uVar46 + lVar48);
                            goto LAB_0012c7de;
                          }
                          uVar51 = *(ulong *)((long)local_148 + lVar48 + uVar46);
                          lVar48 = lVar48 + 8;
                        } while (uVar51 == *puVar27);
                        uVar51 = *puVar27 ^ uVar51;
                        uVar46 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                          }
                        }
                        uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar48;
                      }
                      else {
                        uVar51 = *puVar58 ^ *puVar28;
                        uVar46 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                          }
                        }
                        uVar46 = uVar46 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_0012c7de:
                      if ((puVar27 < local_198) && ((uint)*puVar28 == (uint)*puVar27)) {
                        puVar27 = (ulong *)((long)puVar27 + 4);
                        puVar28 = (ulong *)((long)puVar28 + 4);
                      }
                      if ((puVar27 < local_1a0) && ((short)*puVar28 == (short)*puVar27)) {
                        puVar27 = (ulong *)((long)puVar27 + 2);
                        puVar28 = (ulong *)((long)puVar28 + 2);
                      }
                      if (puVar27 < local_1c0) {
                        puVar27 = (ulong *)((long)puVar27 +
                                           (ulong)((BYTE)*puVar28 == (BYTE)*puVar27));
                      }
                      uVar46 = (long)puVar27 - (long)puVar58;
                    }
                    puVar60 = (ulong *)(uVar46 + (long)puVar60);
                    if (local_220 < puVar60) {
                      if (uVar47 < uVar44 || uVar47 - uVar44 == 0) goto LAB_0012e0bc;
                      if ((ulong *)(ulong)(uVar47 - uVar44) < puVar60) {
                        uVar47 = uVar44 + (U32)puVar60;
                      }
                      pZVar4[(long)local_238].off = (int)local_120 - uVar44;
                      pZVar4[(long)local_238].len = (U32)puVar60;
                      local_238 = (U32 *)(ulong)((int)local_238 + 1);
                      if (((ulong *)0x1000 < puVar60) ||
                         (local_220 = puVar60, (ulong *)((long)puVar36 + (long)puVar60) == local_1c0
                         )) break;
                    }
                    puVar58 = (ulong *)(local_160 + (uVar44 & local_18c) * 2);
                    if (*(byte *)((long)puVar29 + (long)puVar60) <
                        *(byte *)((long)puVar36 + (long)puVar60)) {
                      *(uint *)local_1a8 = uVar44;
                      if (uVar44 <= (uint)local_140) {
                        local_1a8 = (ulong *)local_1dc;
                        break;
                      }
                      puVar58 = (ulong *)((long)puVar58 + 4);
                      local_1d8 = puVar60;
                      local_1a8 = puVar58;
                    }
                    else {
                      *(uint *)local_210 = uVar44;
                      local_210 = puVar58;
                      local_1e8 = puVar60;
                      if (uVar44 <= (uint)local_140) {
                        local_210 = (ulong *)local_1dc;
                        break;
                      }
                    }
                    bVar65 = uVar45 == 0;
                    uVar45 = uVar45 - 1;
                    if (bVar65) break;
                    uVar44 = (uint)*puVar58;
                  } while ((uint)local_178 <= uVar44);
                }
                *(uint *)local_210 = 0;
                *(uint *)local_1a8 = 0;
                if (uVar47 <= (uint)local_128) goto LAB_0012e1a1;
                ms->nextToUpdate = uVar47 - 8;
                pBVar64 = local_120;
              }
              else if (UVar23 == 3) {
                uVar49 = (ms->cParams).targetLength;
                if (0xffe < uVar49) {
                  uVar49 = 0xfff;
                }
                local_160 = (U32 *)(ms->window).base;
                uVar63 = iVar25 - (int)local_160;
                uVar46 = (ulong)((uint)*puVar36 * -0x61c8864f >>
                                (-(char)(ms->cParams).hashLog & 0x1fU));
                uVar59 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                local_18c = uVar63 - uVar59;
                local_238 = (U32 *)0x0;
                if (uVar63 < uVar59) {
                  local_18c = 0;
                }
                uVar41 = (ms->window).lowLimit;
                uVar44 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                uVar43 = uVar63 - uVar44;
                if (uVar63 - uVar41 <= uVar44) {
                  uVar43 = uVar41;
                }
                local_140 = ms->chainTable;
                uVar44 = (ms->window).dictLimit;
                if (ms->loadedDictEnd != 0) {
                  uVar43 = uVar41;
                }
                local_170 = (ulong *)CONCAT44(local_170._4_4_,uVar43 + (uVar43 == 0));
                local_138 = (BYTE *)CONCAT44(local_138._4_4_,uVar59);
                uVar51 = (ulong)((uVar59 & uVar63) * 2);
                local_178 = (ulong *)(local_140 + uVar51);
                local_228 = (ulong *)(local_140 + uVar51 + 1);
                uVar37 = (ulong)uVar45;
                local_1d8 = (ulong *)ms->hashTable;
                local_1d0 = (U32 *)(ulong)*(uint *)((long)local_1d8 + uVar46 * 4);
                local_128 = (BYTE *)CONCAT44(local_128._4_4_,uVar63 + 8);
                local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar63 + 9);
                local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,(ms->cParams).searchLog);
                uVar51 = uVar37 + 3;
                puVar60 = (ulong *)((long)puVar36 + 3);
                local_210 = local_118;
                do {
                  if (uVar37 == 3) {
                    UVar23 = pZVar35->rep[0] - 1;
                  }
                  else {
                    UVar23 = pZVar35->rep[uVar37];
                  }
                  if (uVar63 < uVar44) goto LAB_0012df55;
                  if (UVar23 - 1 < uVar63 - uVar44) {
                    if (((*(uint *)((long)puVar36 - (ulong)UVar23) ^ (uint)*puVar36) & 0xffffff) ==
                        0) {
                      lVar48 = -(ulong)UVar23;
                      puVar29 = (ulong *)((long)puVar60 + lVar48);
                      puVar58 = puVar60;
                      if (puVar60 < puVar1) {
                        if (*puVar29 == *puVar60) {
                          lVar56 = 0;
                          do {
                            puVar58 = (ulong *)((long)local_188 + lVar56);
                            if (puVar1 <= puVar58) {
                              puVar29 = (ulong *)(lVar48 + (long)puVar58);
                              goto LAB_0012b7b3;
                            }
                            uVar52 = *(ulong *)((long)local_188 + lVar56 + lVar48);
                            lVar56 = lVar56 + 8;
                          } while (uVar52 == *puVar58);
                          uVar52 = *puVar58 ^ uVar52;
                          uVar57 = 0;
                          if (uVar52 != 0) {
                            for (; (uVar52 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                            }
                          }
                          uVar59 = ((uint)(uVar57 >> 3) & 0x1fffffff) + (int)lVar56;
                        }
                        else {
                          uVar57 = *puVar60 ^ *puVar29;
                          uVar52 = 0;
                          if (uVar57 != 0) {
                            for (; (uVar57 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                            }
                          }
                          uVar59 = (uint)(uVar52 >> 3) & 0x1fffffff;
                        }
                      }
                      else {
LAB_0012b7b3:
                        if ((puVar58 < local_198) && ((uint)*puVar29 == (uint)*puVar58)) {
                          puVar58 = (ulong *)((long)puVar58 + 4);
                          puVar29 = (ulong *)((long)puVar29 + 4);
                        }
                        if ((puVar58 < local_1a0) && ((short)*puVar29 == (short)*puVar58)) {
                          puVar58 = (ulong *)((long)puVar58 + 2);
                          puVar29 = (ulong *)((long)puVar29 + 2);
                        }
                        if (puVar58 < local_1c0) {
                          puVar58 = (ulong *)((long)puVar58 +
                                             (ulong)((BYTE)*puVar29 == (BYTE)*puVar58));
                        }
                        uVar59 = (int)puVar58 - (int)puVar60;
                      }
                      uVar59 = uVar59 + 3;
                    }
                    else {
                      uVar59 = 0;
                    }
                  }
                  else {
                    if (uVar63 < uVar43) goto LAB_0012df77;
                    uVar59 = 0;
                  }
                  puVar29 = (ulong *)(ulong)uVar59;
                  if (local_210 < puVar29) {
                    pZVar4[(long)local_238].off = (int)uVar37 - uVar45;
                    pZVar4[(long)local_238].len = uVar59;
                    local_238 = (U32 *)(ulong)((int)local_238 + 1);
                    if ((uVar49 < uVar59) ||
                       (local_210 = puVar29, (ulong *)((long)puVar36 + (long)puVar29) == local_1c0))
                    goto LAB_0012ce7a;
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 < uVar51);
                if (local_210 < (ulong *)0x3) {
                  UVar23 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_fc,(BYTE *)puVar36);
                  if ((UVar23 < (uint)local_170) || (0x3ffff < uVar63 - UVar23)) goto LAB_0012ce10;
                  uVar51 = (ulong)UVar23;
                  if (*(ulong *)((long)local_160 + uVar51) == *puVar36) {
                    lVar48 = 0;
                    do {
                      puVar60 = (ulong *)((long)local_168 + lVar48 + 9);
                      if (puVar1 <= puVar60) {
                        puVar40 = (uint *)((long)local_160 + lVar48 + uVar51 + 8);
                        if ((puVar60 < local_198) && (*puVar40 == (uint)*puVar60)) {
                          puVar60 = (ulong *)((long)local_168 + lVar48 + 0xd);
                          puVar40 = (uint *)((long)local_160 + lVar48 + uVar51 + 0xc);
                        }
                        if ((puVar60 < local_1a0) && ((short)*puVar40 == (short)*puVar60)) {
                          puVar60 = (ulong *)((long)puVar60 + 2);
                          puVar40 = (uint *)((long)puVar40 + 2);
                        }
                        if (puVar60 < local_1c0) {
                          puVar60 = (ulong *)((long)puVar60 +
                                             (ulong)((BYTE)*puVar40 == (BYTE)*puVar60));
                        }
                        puVar60 = (ulong *)((long)puVar60 - (long)puVar36);
                        goto LAB_0012cdbd;
                      }
                      uVar37 = *(ulong *)((long)local_160 + lVar48 + uVar51 + 8);
                      lVar48 = lVar48 + 8;
                    } while (uVar37 == *puVar60);
                    uVar37 = *puVar60 ^ uVar37;
                    uVar51 = 0;
                    if (uVar37 != 0) {
                      for (; (uVar37 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    puVar60 = (ulong *)((uVar51 >> 3 & 0x1fffffff) + lVar48);
                  }
                  else {
                    uVar37 = *puVar36 ^ *(ulong *)((long)local_160 + uVar51);
                    uVar51 = 0;
                    if (uVar37 != 0) {
                      for (; (uVar37 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    puVar60 = (ulong *)(uVar51 >> 3 & 0x1fffffff);
                  }
LAB_0012cdbd:
                  if (puVar60 < (ulong *)0x3) goto LAB_0012ce10;
                  if (uVar63 <= UVar23) goto LAB_0012e286;
                  if ((int)local_238 != 0) goto LAB_0012e2a5;
                  pZVar4->off = (uVar63 - UVar23) + 2;
                  pZVar4->len = (U32)puVar60;
                  if ((puVar60 <= (ulong *)(ulong)uVar49) &&
                     (local_238 = (U32 *)0x1, local_210 = puVar60,
                     (ulong *)((long)puVar36 + (long)puVar60) != local_1c0)) goto LAB_0012ce10;
                  UVar23 = uVar63 + 1;
                  local_238 = (U32 *)0x1;
                }
                else {
LAB_0012ce10:
                  *(uint *)((long)local_1d8 + uVar46 * 4) = uVar63;
                  if ((uint)local_170 <= (uint)local_1d0) {
                    uVar45 = ~(-1 << ((byte)local_1b8 & 0x1f));
                    local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar63 + 2);
                    local_148 = local_160 + 2;
                    puVar29 = (ulong *)0x0;
                    puVar60 = (ulong *)0x0;
                    pUVar30 = local_1d0;
                    pUVar38 = local_160;
                    do {
                      puVar58 = puVar60;
                      if (puVar29 < puVar60) {
                        puVar58 = puVar29;
                      }
                      local_1d8 = puVar29;
                      local_1b8 = puVar60;
                      if (uVar63 <= (uint)pUVar30) goto LAB_0012e03a;
                      uVar46 = ((ulong)pUVar30 & 0xffffffff) + (long)puVar58;
                      if (uVar46 < uVar44) goto LAB_0012e018;
                      pBVar64 = (BYTE *)(((ulong)pUVar30 & 0xffffffff) + (long)pUVar38);
                      local_1d0 = pUVar30;
                      if ((uVar44 <= (uint)pUVar30) &&
                         (iVar25 = bcmp(pBVar64,puVar36,(size_t)puVar58), pUVar38 = local_160,
                         iVar25 != 0)) goto LAB_0012e09d;
                      puVar60 = (ulong *)((long)puVar36 + (long)puVar58);
                      puVar29 = (ulong *)(pBVar64 + (long)puVar58);
                      puVar28 = puVar60;
                      if (puVar60 < puVar1) {
                        if (*puVar29 == *puVar60) {
                          lVar48 = 0;
                          do {
                            puVar28 = (ulong *)((long)puVar58 + lVar48 + local_158);
                            pUVar38 = local_160;
                            if (puVar1 <= puVar28) {
                              puVar29 = (ulong *)((long)local_148 + uVar46 + lVar48);
                              goto LAB_0012d1ee;
                            }
                            uVar51 = *(ulong *)((long)local_148 + lVar48 + uVar46);
                            lVar48 = lVar48 + 8;
                          } while (uVar51 == *puVar28);
                          uVar51 = *puVar28 ^ uVar51;
                          uVar46 = 0;
                          if (uVar51 != 0) {
                            for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                            }
                          }
                          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar48;
                        }
                        else {
                          uVar51 = *puVar60 ^ *puVar29;
                          uVar46 = 0;
                          if (uVar51 != 0) {
                            for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                            }
                          }
                          uVar46 = uVar46 >> 3 & 0x1fffffff;
                        }
                      }
                      else {
LAB_0012d1ee:
                        if ((puVar28 < local_198) && ((uint)*puVar29 == (uint)*puVar28)) {
                          puVar28 = (ulong *)((long)puVar28 + 4);
                          puVar29 = (ulong *)((long)puVar29 + 4);
                        }
                        if ((puVar28 < local_1a0) && ((short)*puVar29 == (short)*puVar28)) {
                          puVar28 = (ulong *)((long)puVar28 + 2);
                          puVar29 = (ulong *)((long)puVar29 + 2);
                        }
                        if (puVar28 < local_1c0) {
                          puVar28 = (ulong *)((long)puVar28 +
                                             (ulong)((BYTE)*puVar29 == (BYTE)*puVar28));
                        }
                        uVar46 = (long)puVar28 - (long)puVar60;
                      }
                      uVar49 = (uint)local_1d0;
                      puVar29 = (ulong *)(uVar46 + (long)puVar58);
                      if (local_210 < puVar29) {
                        if ((uint)local_1a8 < uVar49 || (uint)local_1a8 - uVar49 == 0)
                        goto LAB_0012e0bc;
                        uVar59 = (uint)local_1a8;
                        if ((ulong *)(ulong)((uint)local_1a8 - uVar49) < puVar29) {
                          uVar59 = uVar49 + (U32)puVar29;
                        }
                        local_1a8 = (ulong *)CONCAT44(local_1a8._4_4_,uVar59);
                        pZVar4[(long)local_238].off = (int)local_120 - uVar49;
                        pZVar4[(long)local_238].len = (U32)puVar29;
                        local_238 = (U32 *)(ulong)((int)local_238 + 1);
                        if (((ulong *)0x1000 < puVar29) ||
                           (local_210 = puVar29,
                           (ulong *)((long)puVar36 + (long)puVar29) == local_1c0)) break;
                      }
                      puVar58 = (ulong *)(local_140 + (uVar49 & (uint)local_138) * 2);
                      if (pBVar64[(long)puVar29] < *(byte *)((long)puVar36 + (long)puVar29)) {
                        *(uint *)local_178 = uVar49;
                        if (uVar49 <= local_18c) {
                          local_178 = (ulong *)local_1dc;
                          break;
                        }
                        puVar58 = (ulong *)((long)puVar58 + 4);
                        puVar60 = local_1b8;
                        local_178 = puVar58;
                      }
                      else {
                        *(uint *)local_228 = uVar49;
                        local_228 = puVar58;
                        puVar60 = puVar29;
                        puVar29 = local_1d8;
                        if (uVar49 <= local_18c) {
                          local_228 = (ulong *)local_1dc;
                          break;
                        }
                      }
                      bVar65 = uVar45 == 0;
                      uVar45 = uVar45 - 1;
                      if (bVar65) break;
                      pUVar30 = (U32 *)(ulong)(uint)*puVar58;
                    } while ((uint)local_170 <= (uint)*puVar58);
                  }
                  *(uint *)local_228 = 0;
                  *(uint *)local_178 = 0;
                  if ((uint)local_1a8 <= (uint)local_128) goto LAB_0012e1a1;
                  UVar23 = (uint)local_1a8 - 8;
                }
                ms->nextToUpdate = UVar23;
                pBVar64 = local_120;
              }
              else {
                uVar49 = (ms->cParams).targetLength;
                if (0xffe < uVar49) {
                  uVar49 = 0xfff;
                }
                local_138 = (ms->window).base;
                uVar59 = iVar25 - (int)local_138;
                local_1d0 = (U32 *)(ulong)uVar59;
                uVar63 = (uint)*puVar36 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
                local_18c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                iVar25 = uVar59 - local_18c;
                local_238 = (U32 *)0x0;
                if (uVar59 < local_18c) {
                  iVar25 = 0;
                }
                local_140 = (U32 *)CONCAT44(local_140._4_4_,iVar25);
                uVar41 = (ms->window).lowLimit;
                uVar44 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                uVar43 = uVar59 - uVar44;
                if (uVar59 - uVar41 <= uVar44) {
                  uVar43 = uVar41;
                }
                local_160 = ms->chainTable;
                uVar44 = (ms->window).dictLimit;
                if (ms->loadedDictEnd != 0) {
                  uVar43 = uVar41;
                }
                uVar34 = uVar43 + (uVar43 == 0);
                local_178 = (ulong *)CONCAT44(local_178._4_4_,uVar34);
                uVar46 = (ulong)((local_18c & uVar59) * 2);
                local_1a8 = (ulong *)(local_160 + uVar46);
                puVar29 = (ulong *)(local_160 + uVar46 + 1);
                uVar51 = (ulong)uVar45;
                pUVar30 = ms->hashTable;
                uVar47 = pUVar30[uVar63];
                local_128 = (BYTE *)CONCAT44(local_128._4_4_,uVar59 + 8);
                uVar55 = uVar59 + 9;
                local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,uVar55);
                uVar41 = (ms->cParams).searchLog;
                local_1d8 = (ulong *)CONCAT44(local_1d8._4_4_,uVar41);
                uVar46 = uVar51 + 3;
                puVar60 = (ulong *)((long)puVar36 + 4);
                local_220 = local_118;
                do {
                  if (uVar51 == 3) {
                    UVar23 = pZVar35->rep[0] - 1;
                  }
                  else {
                    UVar23 = pZVar35->rep[uVar51];
                  }
                  local_170 = puVar29;
                  if (uVar59 < uVar44) goto LAB_0012df55;
                  if (UVar23 - 1 < uVar59 - uVar44) {
                    if ((uint)*puVar36 == *(uint *)((long)puVar36 - (ulong)UVar23)) {
                      lVar48 = -(ulong)UVar23;
                      puVar58 = (ulong *)((long)puVar60 + lVar48);
                      puVar28 = puVar60;
                      if (puVar60 < puVar1) {
                        if (*puVar58 == *puVar60) {
                          lVar56 = 0;
                          do {
                            puVar28 = (ulong *)((long)local_1c8 + lVar56);
                            if (puVar1 <= puVar28) {
                              puVar58 = (ulong *)(lVar48 + (long)puVar28);
                              goto LAB_0012c224;
                            }
                            uVar37 = *(ulong *)((long)local_1c8 + lVar56 + lVar48);
                            lVar56 = lVar56 + 8;
                          } while (uVar37 == *puVar28);
                          uVar37 = *puVar28 ^ uVar37;
                          uVar52 = 0;
                          if (uVar37 != 0) {
                            for (; (uVar37 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                            }
                          }
                          uVar42 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar56;
                        }
                        else {
                          uVar52 = *puVar60 ^ *puVar58;
                          uVar37 = 0;
                          if (uVar52 != 0) {
                            for (; (uVar52 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                            }
                          }
                          uVar42 = (uint)(uVar37 >> 3) & 0x1fffffff;
                        }
                      }
                      else {
LAB_0012c224:
                        if ((puVar28 < local_198) && ((uint)*puVar58 == (uint)*puVar28)) {
                          puVar28 = (ulong *)((long)puVar28 + 4);
                          puVar58 = (ulong *)((long)puVar58 + 4);
                        }
                        if ((puVar28 < local_1a0) && ((short)*puVar58 == (short)*puVar28)) {
                          puVar28 = (ulong *)((long)puVar28 + 2);
                          puVar58 = (ulong *)((long)puVar58 + 2);
                        }
                        if (puVar28 < local_1c0) {
                          puVar28 = (ulong *)((long)puVar28 +
                                             (ulong)((BYTE)*puVar58 == (BYTE)*puVar28));
                        }
                        uVar42 = (int)puVar28 - (int)puVar60;
                      }
                      uVar42 = uVar42 + 4;
                    }
                    else {
                      uVar42 = 0;
                    }
                  }
                  else {
                    if (uVar59 < uVar43) goto LAB_0012df77;
                    uVar42 = 0;
                  }
                  puVar58 = (ulong *)(ulong)uVar42;
                  if (local_220 < puVar58) {
                    pZVar4[(long)local_238].off = (int)uVar51 - uVar45;
                    pZVar4[(long)local_238].len = uVar42;
                    local_238 = (U32 *)(ulong)((int)local_238 + 1);
                    if ((uVar49 < uVar42) ||
                       (local_220 = puVar58, (ulong *)((long)puVar36 + (long)puVar58) == local_1c0))
                    goto LAB_0012ce7a;
                  }
                  uVar51 = uVar51 + 1;
                } while (uVar51 < uVar46);
                pUVar30[uVar63] = uVar59;
                if (uVar34 <= uVar47) {
                  uVar45 = ~(-1 << ((byte)uVar41 & 0x1f));
                  local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar59 + 2);
                  local_148 = (U32 *)(local_138 + 8);
                  local_1d8 = (ulong *)0x0;
                  local_1e8 = (ulong *)0x0;
                  do {
                    puVar60 = local_1e8;
                    if (local_1d8 < local_1e8) {
                      puVar60 = local_1d8;
                    }
                    if ((uint)local_1d0 <= uVar47) goto LAB_0012e03a;
                    uVar46 = (ulong)uVar47 + (long)puVar60;
                    if (uVar46 < uVar44) goto LAB_0012e018;
                    pBVar64 = local_138 + uVar47;
                    if (uVar44 <= uVar47) {
                      local_1b8 = (ulong *)CONCAT44(local_1b8._4_4_,uVar55);
                      local_170 = puVar29;
                      iVar25 = bcmp(pBVar64,puVar36,(size_t)puVar60);
                      puVar29 = local_170;
                      uVar55 = (uint)local_1b8;
                      if (iVar25 != 0) goto LAB_0012e09d;
                    }
                    puVar58 = (ulong *)((long)puVar36 + (long)puVar60);
                    puVar28 = (ulong *)(pBVar64 + (long)puVar60);
                    puVar27 = puVar58;
                    if (puVar58 < puVar1) {
                      if (*puVar28 == *puVar58) {
                        lVar48 = 0;
                        do {
                          puVar27 = (ulong *)((long)puVar60 + lVar48 + local_158);
                          if (puVar1 <= puVar27) {
                            puVar28 = (ulong *)((long)local_148 + uVar46 + lVar48);
                            goto LAB_0012cae2;
                          }
                          uVar51 = *(ulong *)((long)local_148 + lVar48 + uVar46);
                          lVar48 = lVar48 + 8;
                        } while (uVar51 == *puVar27);
                        uVar51 = *puVar27 ^ uVar51;
                        uVar46 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                          }
                        }
                        uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar48;
                      }
                      else {
                        uVar51 = *puVar58 ^ *puVar28;
                        uVar46 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                          }
                        }
                        uVar46 = uVar46 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_0012cae2:
                      if ((puVar27 < local_198) && ((uint)*puVar28 == (uint)*puVar27)) {
                        puVar27 = (ulong *)((long)puVar27 + 4);
                        puVar28 = (ulong *)((long)puVar28 + 4);
                      }
                      if ((puVar27 < local_1a0) && ((short)*puVar28 == (short)*puVar27)) {
                        puVar27 = (ulong *)((long)puVar27 + 2);
                        puVar28 = (ulong *)((long)puVar28 + 2);
                      }
                      if (puVar27 < local_1c0) {
                        puVar27 = (ulong *)((long)puVar27 +
                                           (ulong)((BYTE)*puVar28 == (BYTE)*puVar27));
                      }
                      uVar46 = (long)puVar27 - (long)puVar58;
                    }
                    puVar60 = (ulong *)(uVar46 + (long)puVar60);
                    if (local_220 < puVar60) {
                      if (uVar55 < uVar47 || uVar55 - uVar47 == 0) goto LAB_0012e0bc;
                      if ((ulong *)(ulong)(uVar55 - uVar47) < puVar60) {
                        uVar55 = uVar47 + (U32)puVar60;
                      }
                      pZVar4[(long)local_238].off = (int)local_120 - uVar47;
                      pZVar4[(long)local_238].len = (U32)puVar60;
                      local_238 = (U32 *)(ulong)((int)local_238 + 1);
                      if (((ulong *)0x1000 < puVar60) ||
                         (local_220 = puVar60, (ulong *)((long)puVar36 + (long)puVar60) == local_1c0
                         )) break;
                    }
                    puVar58 = (ulong *)(local_160 + (uVar47 & local_18c) * 2);
                    if (pBVar64[(long)puVar60] < *(byte *)((long)puVar36 + (long)puVar60)) {
                      *(uint *)local_1a8 = uVar47;
                      if (uVar47 <= (uint)local_140) {
                        local_1a8 = (ulong *)local_1dc;
                        break;
                      }
                      puVar58 = (ulong *)((long)puVar58 + 4);
                      local_1d8 = puVar60;
                      local_1a8 = puVar58;
                    }
                    else {
                      *(uint *)puVar29 = uVar47;
                      puVar29 = puVar58;
                      local_1e8 = puVar60;
                      if (uVar47 <= (uint)local_140) {
                        puVar29 = (ulong *)local_1dc;
                        break;
                      }
                    }
                    bVar65 = uVar45 == 0;
                    uVar45 = uVar45 - 1;
                    if (bVar65) break;
                    uVar47 = (uint)*puVar58;
                  } while ((uint)local_178 <= uVar47);
                }
                *(uint *)puVar29 = 0;
                *(uint *)local_1a8 = 0;
                if (uVar55 <= (uint)local_128) goto LAB_0012e1a1;
                ms->nextToUpdate = uVar55 - 8;
                pBVar64 = local_120;
              }
            }
LAB_0012ce7a:
            local_120 = pBVar64;
            if ((int)local_238 != 0) {
              uVar49 = (int)local_238 - 1;
              uVar45 = pZVar4[uVar49].len;
              if ((local_100 < uVar45) || (0xfff < uVar45 + iVar33)) {
                UVar54 = 0;
                if (*local_130 == 0) {
                  UVar54 = pZVar35->litlen;
                }
                UVar23 = pZVar4[uVar49].off;
                uVar49 = iVar33 - UVar54;
                if (0x1000 < iVar33 - UVar54) {
                  uVar49 = 0;
                }
                uVar26 = (ulong)uVar49;
                goto LAB_0012d40a;
              }
              uVar46 = 0;
              do {
                uVar45 = (uint)local_e0;
                if (uVar46 != 0) {
                  uVar45 = pZVar4[uVar46 - 1].len + 1;
                }
                uVar51 = (ulong)pZVar4[uVar46].len;
                if (uVar45 <= pZVar4[uVar46].len) {
                  UVar23 = pZVar4[uVar46].off;
                  if (UVar23 == 0xffffffff) goto LAB_0012def2;
                  uVar49 = 0x1f;
                  if (UVar23 + 1 != 0) {
                    for (; UVar23 + 1 >> uVar49 == 0; uVar49 = uVar49 - 1) {
                    }
                  }
                  do {
                    if (uVar51 < 3) goto LAB_0012df14;
                    UVar24 = (U32)uVar51;
                    if ((ms->opt).priceType == zop_predef) {
                      uVar63 = UVar24 - 2;
                      uVar59 = 0x1f;
                      if (uVar63 != 0) {
                        for (; uVar63 >> uVar59 == 0; uVar59 = uVar59 - 1) {
                        }
                      }
                      if (0x16 < uVar59) goto LAB_0012ded0;
                      iVar25 = (uVar63 * 0x100 >> ((byte)uVar59 & 0x1f)) + (uVar59 + uVar49) * 0x100
                               + 0x1000;
                    }
                    else {
                      uVar59 = (ms->opt).offCodeFreq[uVar49] + 1;
                      if (uVar59 == 0) goto LAB_0012def2;
                      uVar63 = 0x1f;
                      if (uVar59 != 0) {
                        for (; uVar59 >> uVar63 == 0; uVar63 = uVar63 - 1) {
                        }
                      }
                      if (0x16 < uVar63) goto LAB_0012ded0;
                      uVar41 = UVar24 - 3;
                      if (uVar41 < 0x80) {
                        uVar41 = (uint)(byte)ZSTD_MLcode(unsigned_int)::ML_Code[uVar41];
                      }
                      else {
                        uVar43 = 0x1f;
                        if (uVar41 != 0) {
                          for (; uVar41 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                          }
                        }
                        uVar41 = (uVar43 ^ 0xffffffe0) + 0x44;
                      }
                      uVar43 = (ms->opt).matchLengthFreq[uVar41] + 1;
                      if (uVar43 == 0) goto LAB_0012def2;
                      uVar44 = 0x1f;
                      if (uVar43 != 0) {
                        for (; uVar43 >> uVar44 == 0; uVar44 = uVar44 - 1) {
                        }
                      }
                      if (0x16 < uVar44) goto LAB_0012ded0;
                      iVar25 = (((ms->opt).matchLengthSumBasePrice + (ms->opt).offCodeSumBasePrice)
                               - ((uVar59 * 0x100 >> ((byte)uVar63 & 0x1f)) +
                                 (uVar43 * 0x100 >> ((byte)uVar44 & 0x1f)))) +
                               ((ML_bits[uVar41] + uVar49) - (uVar63 + uVar44)) * 0x100 + 0x33;
                    }
                    iVar25 = iVar25 + UVar54 + iVar39;
                    uVar37 = (ulong)(UVar24 + iVar33);
                    if ((uint)uVar50 < UVar24 + iVar33) {
                      uVar50 = uVar50 & 0xffffffff;
                      pZVar35 = local_a0 + uVar50;
                      do {
                        uVar50 = uVar50 + 1;
                        pZVar35->price = 0x40000000;
                        pZVar35 = pZVar35 + 1;
                      } while (uVar50 < uVar37);
LAB_0012d020:
                      pZVar61[uVar37].mlen = UVar24;
                      pZVar61[uVar37].off = UVar23;
                      pZVar61[uVar37].litlen = (U32)local_180;
                      pZVar61[uVar37].price = iVar25;
                    }
                    else if (iVar25 < pZVar61[uVar37].price) goto LAB_0012d020;
                    uVar51 = uVar51 - 1;
                  } while (uVar45 <= (uint)uVar51);
                }
                uVar46 = uVar46 + 1;
              } while ((U32 *)uVar46 != local_238);
            }
          }
        }
        local_1c8 = (ulong *)((long)local_1c8 + 1);
        local_158 = local_158 + 1;
        local_188 = (uint *)((long)local_188 + 1);
        local_168 = (ulong *)((long)local_168 + 1);
        bVar65 = uVar26 < (uVar50 & 0xffffffff);
        uVar26 = uVar26 + 1;
      } while (bVar65);
    }
    uVar26 = uVar50 & 0xffffffff;
    local_ec = pZVar61[uVar26].price;
    UVar23 = pZVar61[uVar26].off;
    uVar45 = pZVar61[uVar26].mlen;
    local_180 = (ulong)pZVar61[uVar26].litlen;
    local_d0 = pZVar61[uVar26].rep[2];
    local_d8 = *(undefined8 *)pZVar61[uVar26].rep;
    uVar49 = pZVar61[uVar26].litlen + uVar45;
    uVar59 = (uint)uVar50 - uVar49;
    uVar26 = (ulong)uVar59;
    if ((uint)uVar50 < uVar49 || uVar59 == 0) goto LAB_0012d407;
    if (0xfff < uVar59) {
      __assert_fail("cur < ZSTD_OPT_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4995,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
  }
LAB_0012d40a:
  if (pZVar61->mlen != 0) {
    __assert_fail("opt[0].mlen == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4998,
                  "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                 );
  }
  iVar39 = (int)uVar26;
  if (uVar45 == 0) {
    (*local_150)[2] = pZVar61[uVar26].rep[2];
    *(undefined8 *)*local_150 = *(undefined8 *)pZVar61[uVar26].rep;
  }
  else {
    rVar67 = ZSTD_updateRep(pZVar61[uVar26].rep,UVar23,(uint)((int)local_180 == 0));
    *local_150 = rVar67.rep;
  }
  uVar49 = iVar39 + 1;
  if (0xfff < uVar49) {
    __assert_fail("storeEnd < ZSTD_OPT_NUM",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x49ab,
                  "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                 );
  }
  uVar46 = (ulong)uVar49;
  pZVar61[uVar46].price = local_ec;
  pZVar61[uVar46].off = UVar23;
  pZVar61[uVar46].mlen = uVar45;
  pZVar61[uVar46].litlen = (U32)local_180;
  *(undefined8 *)pZVar61[uVar46].rep = local_d8;
  pZVar61[uVar46].rep[2] = local_d0;
  uVar50 = uVar26;
  src = local_1b0;
  if (iVar39 == 0) {
    uVar45 = 1;
LAB_0012d54a:
    uVar26 = (ulong)uVar45;
    do {
      uVar45 = pZVar61[uVar26].litlen;
      uVar50 = (ulong)uVar45;
      UVar54 = pZVar61[uVar26].mlen;
      if (UVar54 == 0) {
        if (uVar26 != uVar46) {
          __assert_fail("storePos == storeEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x49c4,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        ip = (ulong *)(uVar50 + (long)src);
      }
      else {
        puVar36 = (ulong *)(uVar50 + (long)src);
        if (local_1c0 < puVar36) {
          __assert_fail("anchor + llen <= iend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x49c9,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        UVar23 = pZVar61[uVar26].off;
        local_1b0 = (ulong *)src;
        ZSTD_updateStats(local_110,uVar45,(BYTE *)src,UVar23,UVar54);
        if (local_f8->maxNbSeq <=
            (ulong)((long)local_f8->sequences - (long)local_f8->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_f8->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        puVar60 = (ulong *)local_f8->lit;
        if (local_f8->litStart + local_f8->maxNbLit < (BYTE *)((long)puVar60 + uVar50)) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_b0 < puVar36) {
          ZSTD_safecopyLiterals((BYTE *)puVar60,(BYTE *)local_1b0,(BYTE *)puVar36,(BYTE *)local_b0);
LAB_0012d614:
          local_f8->lit = local_f8->lit + uVar50;
          if (0xffff < uVar45) {
            if (local_f8->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_f8->longLengthID = 1;
            local_f8->longLengthPos =
                 (U32)((ulong)((long)local_f8->sequences - (long)local_f8->sequencesStart) >> 3);
          }
        }
        else {
          uVar51 = local_1b0[1];
          *puVar60 = *local_1b0;
          puVar60[1] = uVar51;
          if (0x10 < uVar45) {
            pBVar64 = local_f8->lit;
            lVar48 = (long)(pBVar64 + 0x10) - (long)(local_1b0 + 2);
            if (lVar48 < 8) {
              if (-0x10 < lVar48) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
            }
            else if (0xffffffffffffffe0 < lVar48 - 0x10U) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar51 = local_1b0[3];
            *(ulong *)(pBVar64 + 0x10) = local_1b0[2];
            *(ulong *)(pBVar64 + 0x18) = uVar51;
            if (uVar50 - 0x21 < 0xffffffffffffffef) {
              lVar48 = 0;
              do {
                puVar2 = (undefined8 *)((long)local_1b0 + lVar48 + 0x20);
                uVar10 = puVar2[1];
                pBVar53 = pBVar64 + lVar48 + 0x20;
                *(undefined8 *)pBVar53 = *puVar2;
                *(undefined8 *)(pBVar53 + 8) = uVar10;
                puVar2 = (undefined8 *)((long)local_1b0 + lVar48 + 0x30);
                uVar10 = puVar2[1];
                *(undefined8 *)(pBVar53 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar53 + 0x18) = uVar10;
                lVar48 = lVar48 + 0x20;
              } while (pBVar53 + 0x20 < pBVar64 + uVar50);
              goto LAB_0012d614;
            }
          }
          local_f8->lit = local_f8->lit + uVar50;
        }
        psVar5 = local_f8->sequences;
        psVar5->litLength = (U16)uVar45;
        psVar5->offset = UVar23 + 1;
        if (0xffff < UVar54 - 3) {
          if (local_f8->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_f8->longLengthID = 2;
          local_f8->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)local_f8->sequencesStart) >> 3);
        }
        psVar5->matchLength = (U16)(UVar54 - 3);
        local_f8->sequences = psVar5 + 1;
        ip = (ulong *)((long)local_1b0 + (ulong)(UVar54 + uVar45));
        src = ip;
        pZVar61 = local_108;
      }
      uVar26 = uVar26 + 1;
    } while (iVar39 + 2 != (int)uVar26);
  }
  else {
    do {
      uVar59 = (uint)uVar50;
      uVar63 = pZVar61[uVar50].litlen + pZVar61[uVar50].mlen;
      uVar45 = (uint)uVar26;
      pZVar35 = pZVar61 + uVar50;
      iVar25 = pZVar35->price;
      UVar23 = pZVar35->off;
      UVar24 = pZVar35->mlen;
      UVar21 = pZVar35->litlen;
      pZVar35 = pZVar61 + uVar50;
      UVar54 = pZVar35->rep[0];
      uVar10 = *(undefined8 *)(&pZVar35->litlen + 2);
      pZVar20 = pZVar61 + uVar26;
      pZVar20->litlen = pZVar35->litlen;
      pZVar20->rep[0] = UVar54;
      *(undefined8 *)(&pZVar20->litlen + 2) = uVar10;
      pZVar35 = pZVar61 + uVar26;
      pZVar35->price = iVar25;
      pZVar35->off = UVar23;
      pZVar35->mlen = UVar24;
      pZVar35->litlen = UVar21;
      uVar26 = (ulong)(uVar45 - 1);
      uVar50 = (ulong)(uVar59 - uVar63);
      if (uVar63 > uVar59) {
        uVar50 = 0;
      }
    } while (uVar63 <= uVar59 && uVar59 - uVar63 != 0);
    if (uVar45 <= uVar49) goto LAB_0012d54a;
  }
  ZSTD_setBasePrices(local_110,2);
LAB_0012d798:
  if (local_e8 <= ip) goto LAB_0012deb5;
  goto LAB_00129b79;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}